

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_eval_simd.h
# Opt level: O2

vboolf_impl<4> __thiscall
embree::sse2::
PatchEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
::eval(PatchEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
       *this,vboolf_impl<4> *valid,Ref This,vfloat_impl<4> *u,vfloat_impl<4> *v,float dscale,
      size_t depth)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  float fVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  uint uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  array_t<embree::CatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL> *paVar17
  ;
  array_t<embree::CatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL> *paVar18
  ;
  uint uVar19;
  size_t i_2;
  DynamicStackArray<float,_16UL,_64UL> *pDVar20;
  float *pfVar21;
  long lVar22;
  vfloat_impl<4> *pvVar23;
  uint *puVar24;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  long lVar26;
  long lVar27;
  size_t sVar28;
  uint *puVar29;
  uint *puVar30;
  uint *puVar31;
  uint *puVar32;
  uint *puVar33;
  size_t i;
  long lVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar44;
  float fVar47;
  float fVar52;
  undefined1 auVar41 [16];
  float fVar45;
  float fVar46;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar53;
  float fVar54;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float *pfVar51;
  float fVar55;
  float fVar62;
  float fVar63;
  float fVar64;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar65;
  undefined1 auVar59 [16];
  float fVar66;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar67;
  float fVar68;
  float fVar74;
  float fVar75;
  undefined1 auVar69 [16];
  float fVar76;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar103;
  float fVar104;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar105;
  undefined1 auVar102 [16];
  float fVar106;
  float fVar110;
  float fVar111;
  undefined1 in_XMM6 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar112;
  undefined1 auVar109 [16];
  float fVar116;
  undefined1 in_XMM7 [16];
  undefined1 auVar113 [16];
  float fVar117;
  float fVar118;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar128 [16];
  float fVar129;
  uint uVar130;
  uint uVar131;
  uint uVar132;
  uint uVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar144;
  float fVar146;
  undefined1 auVar140 [16];
  float fVar148;
  undefined1 auVar141 [16];
  float fVar145;
  float fVar147;
  float fVar149;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar156;
  vboolf_impl<4> vVar157;
  size_t in_stack_00000008;
  CatmullClarkPatch patch;
  DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *local_e40;
  undefined1 local_e10 [8];
  float fStack_e08;
  float fStack_e04;
  undefined1 local_e00 [8];
  float fStack_df8;
  float fStack_df4;
  FeatureAdaptiveEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
  local_dc0;
  array_t<embree::CatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>
  local_d80;
  Ref RVar25;
  
  RVar25.ptr = This.ptr;
  if (u == (vfloat_impl<4> *)0x0) {
switchD_005cae46_caseD_5:
    pfVar21 = (float *)mm_lookupmask_ps._0_8_;
    pfVar51 = (float *)mm_lookupmask_ps._8_8_;
    goto LAB_005cd608;
  }
  RVar25.ptr = in_stack_00000008;
  switch((uint)u & 0xf) {
  case 1:
    uVar37 = (ulong)u & 0xfffffffffffffff0;
    puVar33 = *(uint **)&valid->field_0;
    lVar27 = *(long *)((long)&valid->field_0 + 8);
    lVar36 = *(long *)&valid[1].field_0;
    lVar22 = *(long *)((long)&valid[1].field_0 + 8);
    lVar4 = *(long *)&valid[2].field_0;
    RVar25.ptr = *(size_t *)((long)&valid[2].field_0 + 8);
    lVar5 = *(long *)&valid[3].field_0;
    lVar6 = *(long *)((long)&valid[3].field_0 + 8);
    if (puVar33 != (uint *)0x0) {
      for (lVar26 = 0; lVar6 != lVar26; lVar26 = lVar26 + 1) {
        fVar39 = *(float *)(uVar37 + lVar26 * 4);
        fVar46 = *(float *)(uVar37 + 0x10 + lVar26 * 4) - fVar39;
        fVar49 = (v->field_0).v[1];
        fVar53 = (v->field_0).v[2];
        fVar119 = (v->field_0).v[3];
        fVar38 = fVar46 * (v->field_0).v[0] + fVar39;
        fVar44 = fVar46 * fVar49 + fVar39;
        fVar47 = fVar46 * fVar53 + fVar39;
        fVar39 = fVar46 * fVar119 + fVar39;
        fVar46 = *(float *)(uVar37 + 0x30 + lVar26 * 4);
        fVar52 = *(float *)(uVar37 + 0x20 + lVar26 * 4) - fVar46;
        fVar121 = *(float *)(depth + 4);
        fVar123 = *(float *)(depth + 8);
        fVar125 = *(float *)(depth + 0xc);
        uVar19 = *(uint *)(This.ptr + 4);
        uVar12 = *(uint *)(This.ptr + 8);
        uVar13 = *(uint *)(This.ptr + 0xc);
        *puVar33 = ~*(uint *)This.ptr & *puVar33 |
                   (uint)(((fVar52 * (v->field_0).v[0] + fVar46) - fVar38) * *(float *)depth +
                         fVar38) & *(uint *)This.ptr;
        puVar33[1] = ~uVar19 & puVar33[1] |
                     (uint)(((fVar52 * fVar49 + fVar46) - fVar44) * fVar121 + fVar44) & uVar19;
        puVar33[2] = ~uVar12 & puVar33[2] |
                     (uint)(((fVar52 * fVar53 + fVar46) - fVar47) * fVar123 + fVar47) & uVar12;
        puVar33[3] = ~uVar13 & puVar33[3] |
                     (uint)(((fVar52 * fVar119 + fVar46) - fVar39) * fVar125 + fVar39) & uVar13;
        puVar33 = puVar33 + lVar5;
      }
    }
    if (lVar27 != 0) {
      lVar26 = 0;
      for (lVar34 = 0; lVar6 != lVar34; lVar34 = lVar34 + 1) {
        fVar119 = *(float *)(uVar37 + 0x10 + lVar34 * 4) - *(float *)(uVar37 + lVar34 * 4);
        fVar53 = (*(float *)(uVar37 + 0x20 + lVar34 * 4) - *(float *)(uVar37 + 0x30 + lVar34 * 4)) -
                 fVar119;
        fVar39 = *(float *)(depth + 4);
        fVar46 = *(float *)(depth + 8);
        fVar49 = *(float *)(depth + 0xc);
        uVar19 = *(uint *)(This.ptr + 4);
        uVar12 = *(uint *)(This.ptr + 8);
        uVar13 = *(uint *)(This.ptr + 0xc);
        puVar33 = (uint *)(lVar27 + lVar26 * 4);
        uVar130 = puVar33[1];
        uVar131 = puVar33[2];
        uVar132 = puVar33[3];
        puVar32 = (uint *)(lVar27 + lVar26 * 4);
        *puVar32 = ~*(uint *)This.ptr & *puVar33 |
                   (uint)((fVar53 * *(float *)depth + fVar119) * dscale) & *(uint *)This.ptr;
        puVar32[1] = ~uVar19 & uVar130 | (uint)((fVar53 * fVar39 + fVar119) * dscale) & uVar19;
        puVar32[2] = ~uVar12 & uVar131 | (uint)((fVar53 * fVar46 + fVar119) * dscale) & uVar12;
        puVar32[3] = ~uVar13 & uVar132 | (uint)((fVar53 * fVar49 + fVar119) * dscale) & uVar13;
        fVar119 = *(float *)(uVar37 + 0x30 + lVar34 * 4) - *(float *)(uVar37 + lVar34 * 4);
        fVar53 = (*(float *)(uVar37 + 0x20 + lVar34 * 4) - *(float *)(uVar37 + 0x10 + lVar34 * 4)) -
                 fVar119;
        fVar39 = (v->field_0).v[1];
        fVar46 = (v->field_0).v[2];
        fVar49 = (v->field_0).v[3];
        uVar19 = *(uint *)(This.ptr + 4);
        uVar12 = *(uint *)(This.ptr + 8);
        uVar13 = *(uint *)(This.ptr + 0xc);
        puVar33 = (uint *)(lVar36 + lVar26 * 4);
        uVar130 = puVar33[1];
        uVar131 = puVar33[2];
        uVar132 = puVar33[3];
        puVar32 = (uint *)(lVar36 + lVar26 * 4);
        *puVar32 = ~*(uint *)This.ptr & *puVar33 |
                   (uint)((fVar53 * (v->field_0).v[0] + fVar119) * dscale) & *(uint *)This.ptr;
        puVar32[1] = ~uVar19 & uVar130 | (uint)((fVar53 * fVar39 + fVar119) * dscale) & uVar19;
        puVar32[2] = ~uVar12 & uVar131 | (uint)((fVar53 * fVar46 + fVar119) * dscale) & uVar12;
        puVar32[3] = ~uVar13 & uVar132 | (uint)((fVar53 * fVar49 + fVar119) * dscale) & uVar13;
        lVar26 = lVar26 + lVar5;
      }
    }
    if (lVar22 != 0) {
      fVar39 = dscale * dscale * 0.0;
      lVar27 = 0;
      for (lVar36 = 0; lVar6 != lVar36; lVar36 = lVar36 + 1) {
        uVar19 = *(uint *)(This.ptr + 4);
        uVar12 = *(uint *)(This.ptr + 8);
        uVar13 = *(uint *)(This.ptr + 0xc);
        puVar33 = (uint *)(lVar22 + lVar27 * 4);
        uVar130 = puVar33[1];
        uVar131 = puVar33[2];
        uVar132 = puVar33[3];
        puVar32 = (uint *)(lVar22 + lVar27 * 4);
        *puVar32 = ~*(uint *)This.ptr & *puVar33 | *(uint *)This.ptr & (uint)fVar39;
        puVar32[1] = ~uVar19 & uVar130 | uVar19 & (uint)fVar39;
        puVar32[2] = ~uVar12 & uVar131 | uVar12 & (uint)fVar39;
        puVar32[3] = ~uVar13 & uVar132 | uVar13 & (uint)fVar39;
        uVar19 = *(uint *)(This.ptr + 4);
        uVar12 = *(uint *)(This.ptr + 8);
        uVar13 = *(uint *)(This.ptr + 0xc);
        puVar33 = (uint *)(lVar4 + lVar27 * 4);
        uVar130 = puVar33[1];
        uVar131 = puVar33[2];
        uVar132 = puVar33[3];
        puVar32 = (uint *)(lVar4 + lVar27 * 4);
        *puVar32 = ~*(uint *)This.ptr & *puVar33 | *(uint *)This.ptr & (uint)fVar39;
        puVar32[1] = ~uVar19 & uVar130 | uVar19 & (uint)fVar39;
        puVar32[2] = ~uVar12 & uVar131 | uVar12 & (uint)fVar39;
        puVar32[3] = ~uVar13 & uVar132 | uVar13 & (uint)fVar39;
        fVar46 = ((*(float *)(uVar37 + 0x20 + lVar36 * 4) - *(float *)(uVar37 + 0x30 + lVar36 * 4))
                 - (*(float *)(uVar37 + 0x10 + lVar36 * 4) - *(float *)(uVar37 + lVar36 * 4))) *
                 dscale * dscale;
        uVar19 = *(uint *)(This.ptr + 4);
        uVar12 = *(uint *)(This.ptr + 8);
        uVar13 = *(uint *)(This.ptr + 0xc);
        puVar33 = (uint *)(RVar25.ptr + lVar27 * 4);
        uVar130 = puVar33[1];
        uVar131 = puVar33[2];
        uVar132 = puVar33[3];
        puVar32 = (uint *)(RVar25.ptr + lVar27 * 4);
        *puVar32 = ~*(uint *)This.ptr & *puVar33 | (uint)fVar46 & *(uint *)This.ptr;
        puVar32[1] = ~uVar19 & uVar130 | (uint)fVar46 & uVar19;
        puVar32[2] = ~uVar12 & uVar131 | (uint)fVar46 & uVar12;
        puVar32[3] = ~uVar13 & uVar132 | (uint)fVar46 & uVar13;
        lVar27 = lVar27 + lVar5;
      }
    }
    goto LAB_005cb0e2;
  case 2:
    BSplinePatchT<embree::vfloat_impl<4>,embree::vfloat_impl<4>>::
    eval<embree::vboolf_impl<4>,embree::vfloat_impl<4>>
              ((BSplinePatchT<embree::vfloat_impl<4>,embree::vfloat_impl<4>> *)
               ((ulong)u & 0xfffffffffffffff0),(vboolf_impl<4> *)This.ptr,v,(vfloat_impl<4> *)depth,
               *(float **)&valid->field_0,*(float **)((long)&valid->field_0 + 8),
               *(float **)&valid[1].field_0,*(float **)((long)&valid[1].field_0 + 8),
               *(float **)&valid[2].field_0,*(float **)((long)&valid[2].field_0 + 8),dscale,
               *(size_t *)&valid[3].field_0,*(size_t *)((long)&valid[3].field_0 + 8));
    RVar25.ptr = extraout_RDX;
LAB_005cb0e2:
    pfVar21 = *(float **)This.ptr;
    pfVar51 = *(float **)(This.ptr + 8);
LAB_005cd608:
    this->P = pfVar21;
    this->dPdu = pfVar51;
    break;
  case 3:
    uVar37 = (ulong)u & 0xfffffffffffffff0;
    puVar33 = *(uint **)&valid->field_0;
    puVar32 = *(uint **)((long)&valid->field_0 + 8);
    puVar31 = *(uint **)&valid[1].field_0;
    puVar30 = *(uint **)((long)&valid[1].field_0 + 8);
    puVar29 = *(uint **)&valid[2].field_0;
    puVar24 = *(uint **)((long)&valid[2].field_0 + 8);
    lVar27 = *(long *)&valid[3].field_0;
    RVar25.ptr = *(size_t *)((long)&valid[3].field_0 + 8);
    if (puVar33 != (uint *)0x0) {
      fVar39 = (v->field_0).v[0];
      fVar46 = (v->field_0).v[1];
      fVar49 = (v->field_0).v[2];
      fVar53 = (v->field_0).v[3];
      fVar55 = 1.0 - fVar39;
      fVar63 = 1.0 - fVar46;
      fVar77 = 1.0 - fVar49;
      fVar85 = 1.0 - fVar53;
      fVar119 = *(float *)depth;
      fVar121 = *(float *)(depth + 4);
      fVar123 = *(float *)(depth + 8);
      fVar125 = *(float *)(depth + 0xc);
      fVar79 = 1.0 - fVar119;
      fVar83 = 1.0 - fVar121;
      fVar87 = 1.0 - fVar123;
      fVar91 = 1.0 - fVar125;
      fVar38 = fVar119 * fVar119 * 3.0 * fVar79;
      fVar44 = fVar121 * fVar121 * 3.0 * fVar83;
      fVar47 = fVar123 * fVar123 * 3.0 * fVar87;
      fVar52 = fVar125 * fVar125 * 3.0 * fVar91;
      fVar62 = fVar79 * fVar79 * fVar79;
      fVar64 = fVar83 * fVar83 * fVar83;
      fVar81 = fVar87 * fVar87 * fVar87;
      fVar89 = fVar91 * fVar91 * fVar91;
      fVar79 = fVar119 * 3.0 * fVar79 * fVar79;
      fVar83 = fVar121 * 3.0 * fVar83 * fVar83;
      fVar87 = fVar123 * 3.0 * fVar87 * fVar87;
      fVar91 = fVar125 * 3.0 * fVar91 * fVar91;
      fVar119 = fVar119 * fVar119 * fVar119;
      fVar121 = fVar121 * fVar121 * fVar121;
      fVar123 = fVar123 * fVar123 * fVar123;
      fVar125 = fVar125 * fVar125 * fVar125;
      for (sVar28 = 0; RVar25.ptr != sVar28; sVar28 = sVar28 + 1) {
        fVar120 = *(float *)(uVar37 + sVar28 * 4);
        fVar122 = *(float *)(uVar37 + 0x10 + sVar28 * 4);
        fVar124 = *(float *)(uVar37 + 0x20 + sVar28 * 4);
        fVar126 = *(float *)(uVar37 + 0x30 + sVar28 * 4);
        fVar134 = *(float *)(uVar37 + 0x40 + sVar28 * 4);
        fVar135 = *(float *)(uVar37 + 0x80 + sVar28 * 4);
        fVar136 = *(float *)(uVar37 + 0xc0 + sVar28 * 4);
        fVar137 = *(float *)(uVar37 + 0x50 + sVar28 * 4);
        fVar127 = *(float *)(uVar37 + 0x90 + sVar28 * 4);
        fVar3 = *(float *)(uVar37 + 0xd0 + sVar28 * 4);
        fVar139 = *(float *)(uVar37 + 0x60 + sVar28 * 4);
        fVar94 = *(float *)(uVar37 + 0xa0 + sVar28 * 4);
        fVar103 = *(float *)(uVar37 + 0xe0 + sVar28 * 4);
        fVar104 = *(float *)(uVar37 + 0x70 + sVar28 * 4);
        fVar105 = *(float *)(uVar37 + 0xb0 + sVar28 * 4);
        fVar145 = *(float *)(uVar37 + 0xf0 + sVar28 * 4);
        uVar19 = *(uint *)(This.ptr + 4);
        uVar12 = *(uint *)(This.ptr + 8);
        uVar13 = *(uint *)(This.ptr + 0xc);
        *puVar33 = ~*(uint *)This.ptr & *puVar33 |
                   (uint)((fVar145 * fVar119 +
                          fVar105 * fVar38 + fVar104 * fVar79 + fVar126 * fVar62) *
                          fVar39 * fVar39 * fVar39 +
                         (fVar103 * fVar119 + fVar94 * fVar38 + fVar139 * fVar79 + fVar124 * fVar62)
                         * fVar39 * fVar39 * 3.0 * fVar55 +
                         (fVar3 * fVar119 + fVar127 * fVar38 + fVar137 * fVar79 + fVar122 * fVar62)
                         * fVar39 * 3.0 * fVar55 * fVar55 +
                         (fVar136 * fVar119 + fVar135 * fVar38 + fVar134 * fVar79 + fVar120 * fVar62
                         ) * fVar55 * fVar55 * fVar55) & *(uint *)This.ptr;
        puVar33[1] = ~uVar19 & puVar33[1] |
                     (uint)((fVar145 * fVar121 +
                            fVar105 * fVar44 + fVar104 * fVar83 + fVar126 * fVar64) *
                            fVar46 * fVar46 * fVar46 +
                           (fVar103 * fVar121 +
                           fVar94 * fVar44 + fVar139 * fVar83 + fVar124 * fVar64) *
                           fVar46 * fVar46 * 3.0 * fVar63 +
                           (fVar3 * fVar121 + fVar127 * fVar44 + fVar137 * fVar83 + fVar122 * fVar64
                           ) * fVar46 * 3.0 * fVar63 * fVar63 +
                           (fVar136 * fVar121 +
                           fVar135 * fVar44 + fVar134 * fVar83 + fVar120 * fVar64) *
                           fVar63 * fVar63 * fVar63) & uVar19;
        puVar33[2] = ~uVar12 & puVar33[2] |
                     (uint)((fVar145 * fVar123 +
                            fVar105 * fVar47 + fVar104 * fVar87 + fVar126 * fVar81) *
                            fVar49 * fVar49 * fVar49 +
                           (fVar103 * fVar123 +
                           fVar94 * fVar47 + fVar139 * fVar87 + fVar124 * fVar81) *
                           fVar49 * fVar49 * 3.0 * fVar77 +
                           (fVar3 * fVar123 + fVar127 * fVar47 + fVar137 * fVar87 + fVar122 * fVar81
                           ) * fVar49 * 3.0 * fVar77 * fVar77 +
                           (fVar136 * fVar123 +
                           fVar135 * fVar47 + fVar134 * fVar87 + fVar120 * fVar81) *
                           fVar77 * fVar77 * fVar77) & uVar12;
        puVar33[3] = ~uVar13 & puVar33[3] |
                     (uint)((fVar145 * fVar125 +
                            fVar105 * fVar52 + fVar104 * fVar91 + fVar126 * fVar89) *
                            fVar53 * fVar53 * fVar53 +
                           (fVar103 * fVar125 +
                           fVar94 * fVar52 + fVar139 * fVar91 + fVar124 * fVar89) *
                           fVar53 * fVar53 * 3.0 * fVar85 +
                           (fVar3 * fVar125 + fVar127 * fVar52 + fVar137 * fVar91 + fVar122 * fVar89
                           ) * fVar53 * 3.0 * fVar85 * fVar85 +
                           (fVar136 * fVar125 +
                           fVar135 * fVar52 + fVar134 * fVar91 + fVar120 * fVar89) *
                           fVar85 * fVar85 * fVar85) & uVar13;
        puVar33 = puVar33 + lVar27;
      }
    }
    if (puVar32 != (uint *)0x0) {
      fVar39 = (v->field_0).v[0];
      fVar46 = (v->field_0).v[1];
      fVar49 = (v->field_0).v[2];
      fVar53 = (v->field_0).v[3];
      fVar55 = 1.0 - fVar39;
      fVar62 = 1.0 - fVar46;
      fVar63 = 1.0 - fVar49;
      fVar64 = 1.0 - fVar53;
      fVar77 = fVar39 * fVar55 + fVar39 * fVar55;
      fVar81 = fVar46 * fVar62 + fVar46 * fVar62;
      fVar85 = fVar49 * fVar63 + fVar49 * fVar63;
      fVar89 = fVar53 * fVar64 + fVar53 * fVar64;
      fVar119 = *(float *)depth;
      fVar121 = *(float *)(depth + 4);
      fVar123 = *(float *)(depth + 8);
      fVar125 = *(float *)(depth + 0xc);
      fVar38 = 1.0 - fVar119;
      fVar44 = 1.0 - fVar121;
      fVar47 = 1.0 - fVar123;
      fVar52 = 1.0 - fVar125;
      fVar79 = fVar119 * fVar119 * fVar119;
      fVar83 = fVar121 * fVar121 * fVar121;
      fVar87 = fVar123 * fVar123 * fVar123;
      fVar91 = fVar125 * fVar125 * fVar125;
      fVar134 = fVar119 * fVar119 * 3.0 * fVar38;
      fVar135 = fVar121 * fVar121 * 3.0 * fVar44;
      fVar136 = fVar123 * fVar123 * 3.0 * fVar47;
      fVar137 = fVar125 * fVar125 * 3.0 * fVar52;
      fVar120 = fVar38 * fVar38 * fVar38;
      fVar122 = fVar44 * fVar44 * fVar44;
      fVar124 = fVar47 * fVar47 * fVar47;
      fVar126 = fVar52 * fVar52 * fVar52;
      fVar119 = fVar119 * 3.0 * fVar38 * fVar38;
      fVar121 = fVar121 * 3.0 * fVar44 * fVar44;
      fVar123 = fVar123 * 3.0 * fVar47 * fVar47;
      fVar125 = fVar125 * 3.0 * fVar52 * fVar52;
      for (sVar28 = 0; RVar25.ptr != sVar28; sVar28 = sVar28 + 1) {
        fVar38 = *(float *)(uVar37 + sVar28 * 4);
        fVar44 = *(float *)(uVar37 + 0x10 + sVar28 * 4);
        fVar47 = *(float *)(uVar37 + 0x20 + sVar28 * 4);
        fVar52 = *(float *)(uVar37 + 0x30 + sVar28 * 4);
        fVar127 = *(float *)(uVar37 + 0x40 + sVar28 * 4);
        fVar3 = *(float *)(uVar37 + 0x80 + sVar28 * 4);
        fVar139 = *(float *)(uVar37 + 0xc0 + sVar28 * 4);
        fVar94 = *(float *)(uVar37 + 0x50 + sVar28 * 4);
        fVar103 = *(float *)(uVar37 + 0x90 + sVar28 * 4);
        fVar104 = *(float *)(uVar37 + 0xd0 + sVar28 * 4);
        fVar105 = *(float *)(uVar37 + 0x60 + sVar28 * 4);
        fVar145 = *(float *)(uVar37 + 0xa0 + sVar28 * 4);
        fVar147 = *(float *)(uVar37 + 0xe0 + sVar28 * 4);
        fVar149 = *(float *)(uVar37 + 0x70 + sVar28 * 4);
        fVar45 = *(float *)(uVar37 + 0xb0 + sVar28 * 4);
        fVar48 = *(float *)(uVar37 + 0xf0 + sVar28 * 4);
        uVar19 = *(uint *)(This.ptr + 4);
        uVar12 = *(uint *)(This.ptr + 8);
        uVar13 = *(uint *)(This.ptr + 0xc);
        *puVar32 = ~*(uint *)This.ptr & *puVar32 |
                   (uint)(((fVar48 * fVar79 +
                           fVar45 * fVar134 + fVar149 * fVar119 + fVar52 * fVar120) *
                           fVar39 * fVar39 * 3.0 +
                          (fVar147 * fVar79 +
                          fVar145 * fVar134 + fVar105 * fVar119 + fVar47 * fVar120) *
                          (fVar77 - fVar39 * fVar39) * 3.0 +
                          ((fVar104 * fVar79 +
                           fVar103 * fVar134 + fVar94 * fVar119 + fVar44 * fVar120) *
                           (fVar55 * fVar55 - fVar77) * 3.0 -
                          (fVar139 * fVar79 + fVar3 * fVar134 + fVar127 * fVar119 + fVar38 * fVar120
                          ) * fVar55 * fVar55 * 3.0)) * dscale) & *(uint *)This.ptr;
        puVar32[1] = ~uVar19 & puVar32[1] |
                     (uint)(((fVar48 * fVar83 +
                             fVar45 * fVar135 + fVar149 * fVar121 + fVar52 * fVar122) *
                             fVar46 * fVar46 * 3.0 +
                            (fVar147 * fVar83 +
                            fVar145 * fVar135 + fVar105 * fVar121 + fVar47 * fVar122) *
                            (fVar81 - fVar46 * fVar46) * 3.0 +
                            ((fVar104 * fVar83 +
                             fVar103 * fVar135 + fVar94 * fVar121 + fVar44 * fVar122) *
                             (fVar62 * fVar62 - fVar81) * 3.0 -
                            (fVar139 * fVar83 +
                            fVar3 * fVar135 + fVar127 * fVar121 + fVar38 * fVar122) *
                            fVar62 * fVar62 * 3.0)) * dscale) & uVar19;
        puVar32[2] = ~uVar12 & puVar32[2] |
                     (uint)(((fVar48 * fVar87 +
                             fVar45 * fVar136 + fVar149 * fVar123 + fVar52 * fVar124) *
                             fVar49 * fVar49 * 3.0 +
                            (fVar147 * fVar87 +
                            fVar145 * fVar136 + fVar105 * fVar123 + fVar47 * fVar124) *
                            (fVar85 - fVar49 * fVar49) * 3.0 +
                            ((fVar104 * fVar87 +
                             fVar103 * fVar136 + fVar94 * fVar123 + fVar44 * fVar124) *
                             (fVar63 * fVar63 - fVar85) * 3.0 -
                            (fVar139 * fVar87 +
                            fVar3 * fVar136 + fVar127 * fVar123 + fVar38 * fVar124) *
                            fVar63 * fVar63 * 3.0)) * dscale) & uVar12;
        puVar32[3] = ~uVar13 & puVar32[3] |
                     (uint)(((fVar48 * fVar91 +
                             fVar45 * fVar137 + fVar149 * fVar125 + fVar52 * fVar126) *
                             fVar53 * fVar53 * 3.0 +
                            (fVar147 * fVar91 +
                            fVar145 * fVar137 + fVar105 * fVar125 + fVar47 * fVar126) *
                            (fVar89 - fVar53 * fVar53) * 3.0 +
                            ((fVar104 * fVar91 +
                             fVar103 * fVar137 + fVar94 * fVar125 + fVar44 * fVar126) *
                             (fVar64 * fVar64 - fVar89) * 3.0 -
                            (fVar139 * fVar91 +
                            fVar3 * fVar137 + fVar127 * fVar125 + fVar38 * fVar126) *
                            fVar64 * fVar64 * 3.0)) * dscale) & uVar13;
        puVar32 = puVar32 + lVar27;
      }
      fVar39 = (v->field_0).v[0];
      fVar46 = (v->field_0).v[1];
      fVar49 = (v->field_0).v[2];
      fVar53 = (v->field_0).v[3];
      fVar77 = 1.0 - fVar39;
      fVar81 = 1.0 - fVar46;
      fVar85 = 1.0 - fVar49;
      fVar89 = 1.0 - fVar53;
      fVar119 = *(float *)depth;
      fVar121 = *(float *)(depth + 4);
      fVar123 = *(float *)(depth + 8);
      fVar125 = *(float *)(depth + 0xc);
      fVar38 = 1.0 - fVar119;
      fVar47 = 1.0 - fVar121;
      fVar55 = 1.0 - fVar123;
      fVar63 = 1.0 - fVar125;
      fVar79 = fVar119 * fVar38 + fVar119 * fVar38;
      fVar83 = fVar121 * fVar47 + fVar121 * fVar47;
      fVar87 = fVar123 * fVar55 + fVar123 * fVar55;
      fVar91 = fVar125 * fVar63 + fVar125 * fVar63;
      fVar44 = fVar38 * fVar38 * -3.0;
      fVar52 = fVar47 * fVar47 * -3.0;
      fVar62 = fVar55 * fVar55 * -3.0;
      fVar64 = fVar63 * fVar63 * -3.0;
      fVar120 = (fVar38 * fVar38 - fVar79) * 3.0;
      fVar122 = (fVar47 * fVar47 - fVar83) * 3.0;
      fVar124 = (fVar55 * fVar55 - fVar87) * 3.0;
      fVar126 = (fVar63 * fVar63 - fVar91) * 3.0;
      fVar38 = (fVar79 - fVar119 * fVar119) * 3.0;
      fVar47 = (fVar83 - fVar121 * fVar121) * 3.0;
      fVar55 = (fVar87 - fVar123 * fVar123) * 3.0;
      fVar63 = (fVar91 - fVar125 * fVar125) * 3.0;
      fVar119 = fVar119 * fVar119 * 3.0;
      fVar121 = fVar121 * fVar121 * 3.0;
      fVar123 = fVar123 * fVar123 * 3.0;
      fVar125 = fVar125 * fVar125 * 3.0;
      for (sVar28 = 0; RVar25.ptr != sVar28; sVar28 = sVar28 + 1) {
        fVar79 = *(float *)(uVar37 + sVar28 * 4);
        fVar83 = *(float *)(uVar37 + 0x10 + sVar28 * 4);
        fVar87 = *(float *)(uVar37 + 0x20 + sVar28 * 4);
        fVar91 = *(float *)(uVar37 + 0x30 + sVar28 * 4);
        fVar134 = *(float *)(uVar37 + 0x40 + sVar28 * 4);
        fVar135 = *(float *)(uVar37 + 0x80 + sVar28 * 4);
        fVar136 = *(float *)(uVar37 + 0xc0 + sVar28 * 4);
        fVar137 = *(float *)(uVar37 + 0x50 + sVar28 * 4);
        fVar127 = *(float *)(uVar37 + 0x90 + sVar28 * 4);
        fVar3 = *(float *)(uVar37 + 0xd0 + sVar28 * 4);
        fVar139 = *(float *)(uVar37 + 0x60 + sVar28 * 4);
        fVar94 = *(float *)(uVar37 + 0xa0 + sVar28 * 4);
        fVar103 = *(float *)(uVar37 + 0xe0 + sVar28 * 4);
        fVar104 = *(float *)(uVar37 + 0x70 + sVar28 * 4);
        fVar105 = *(float *)(uVar37 + 0xb0 + sVar28 * 4);
        fVar145 = *(float *)(uVar37 + 0xf0 + sVar28 * 4);
        uVar19 = *(uint *)(This.ptr + 4);
        uVar12 = *(uint *)(This.ptr + 8);
        uVar13 = *(uint *)(This.ptr + 0xc);
        *puVar31 = ~*(uint *)This.ptr & *puVar31 |
                   (uint)(((fVar145 * fVar119 +
                           fVar105 * fVar38 + fVar104 * fVar120 + fVar91 * fVar44) *
                           fVar39 * fVar39 * fVar39 +
                          (fVar103 * fVar119 + fVar94 * fVar38 + fVar139 * fVar120 + fVar87 * fVar44
                          ) * fVar39 * fVar39 * 3.0 * fVar77 +
                          (fVar3 * fVar119 + fVar127 * fVar38 + fVar137 * fVar120 + fVar83 * fVar44)
                          * fVar39 * 3.0 * fVar77 * fVar77 +
                          (fVar136 * fVar119 +
                          fVar135 * fVar38 + fVar134 * fVar120 + fVar79 * fVar44) *
                          fVar77 * fVar77 * fVar77) * dscale) & *(uint *)This.ptr;
        puVar31[1] = ~uVar19 & puVar31[1] |
                     (uint)(((fVar145 * fVar121 +
                             fVar105 * fVar47 + fVar104 * fVar122 + fVar91 * fVar52) *
                             fVar46 * fVar46 * fVar46 +
                            (fVar103 * fVar121 +
                            fVar94 * fVar47 + fVar139 * fVar122 + fVar87 * fVar52) *
                            fVar46 * fVar46 * 3.0 * fVar81 +
                            (fVar3 * fVar121 +
                            fVar127 * fVar47 + fVar137 * fVar122 + fVar83 * fVar52) *
                            fVar46 * 3.0 * fVar81 * fVar81 +
                            (fVar136 * fVar121 +
                            fVar135 * fVar47 + fVar134 * fVar122 + fVar79 * fVar52) *
                            fVar81 * fVar81 * fVar81) * dscale) & uVar19;
        puVar31[2] = ~uVar12 & puVar31[2] |
                     (uint)(((fVar145 * fVar123 +
                             fVar105 * fVar55 + fVar104 * fVar124 + fVar91 * fVar62) *
                             fVar49 * fVar49 * fVar49 +
                            (fVar103 * fVar123 +
                            fVar94 * fVar55 + fVar139 * fVar124 + fVar87 * fVar62) *
                            fVar49 * fVar49 * 3.0 * fVar85 +
                            (fVar3 * fVar123 +
                            fVar127 * fVar55 + fVar137 * fVar124 + fVar83 * fVar62) *
                            fVar49 * 3.0 * fVar85 * fVar85 +
                            (fVar136 * fVar123 +
                            fVar135 * fVar55 + fVar134 * fVar124 + fVar79 * fVar62) *
                            fVar85 * fVar85 * fVar85) * dscale) & uVar12;
        puVar31[3] = ~uVar13 & puVar31[3] |
                     (uint)(((fVar145 * fVar125 +
                             fVar105 * fVar63 + fVar104 * fVar126 + fVar91 * fVar64) *
                             fVar53 * fVar53 * fVar53 +
                            (fVar103 * fVar125 +
                            fVar94 * fVar63 + fVar139 * fVar126 + fVar87 * fVar64) *
                            fVar53 * fVar53 * 3.0 * fVar89 +
                            (fVar3 * fVar125 +
                            fVar127 * fVar63 + fVar137 * fVar126 + fVar83 * fVar64) *
                            fVar53 * 3.0 * fVar89 * fVar89 +
                            (fVar136 * fVar125 +
                            fVar135 * fVar63 + fVar134 * fVar126 + fVar79 * fVar64) *
                            fVar89 * fVar89 * fVar89) * dscale) & uVar13;
        puVar31 = puVar31 + lVar27;
      }
    }
    if (puVar30 != (uint *)0x0) {
      fVar39 = (v->field_0).v[0];
      fVar46 = (v->field_0).v[1];
      fVar49 = (v->field_0).v[2];
      fVar53 = (v->field_0).v[3];
      fVar38 = 1.0 - fVar39;
      fVar44 = 1.0 - fVar46;
      fVar47 = 1.0 - fVar49;
      fVar52 = 1.0 - fVar53;
      fVar119 = *(float *)depth;
      fVar121 = *(float *)(depth + 4);
      fVar123 = *(float *)(depth + 8);
      fVar125 = *(float *)(depth + 0xc);
      fVar79 = 1.0 - fVar119;
      fVar122 = 1.0 - fVar121;
      fVar124 = 1.0 - fVar123;
      fVar126 = 1.0 - fVar125;
      fVar55 = fVar119 * fVar119 * fVar119;
      fVar62 = fVar121 * fVar121 * fVar121;
      fVar63 = fVar123 * fVar123 * fVar123;
      fVar64 = fVar125 * fVar125 * fVar125;
      fVar83 = fVar119 * fVar119 * 3.0 * fVar79;
      fVar87 = fVar121 * fVar121 * 3.0 * fVar122;
      fVar91 = fVar123 * fVar123 * 3.0 * fVar124;
      fVar120 = fVar125 * fVar125 * 3.0 * fVar126;
      fVar77 = fVar79 * fVar79 * fVar79;
      fVar81 = fVar122 * fVar122 * fVar122;
      fVar85 = fVar124 * fVar124 * fVar124;
      fVar89 = fVar126 * fVar126 * fVar126;
      fVar79 = fVar119 * 3.0 * fVar79 * fVar79;
      fVar121 = fVar121 * 3.0 * fVar122 * fVar122;
      fVar123 = fVar123 * 3.0 * fVar124 * fVar124;
      fVar125 = fVar125 * 3.0 * fVar126 * fVar126;
      lVar36 = uVar37 + 0xf0;
      fVar119 = dscale * dscale;
      for (sVar28 = 0; RVar25.ptr != sVar28; sVar28 = sVar28 + 1) {
        fVar122 = *(float *)(uVar37 + sVar28 * 4);
        fVar124 = *(float *)(uVar37 + 0x10 + sVar28 * 4);
        fVar126 = *(float *)(uVar37 + 0x20 + sVar28 * 4);
        fVar134 = *(float *)(uVar37 + 0x30 + sVar28 * 4);
        fVar135 = *(float *)(uVar37 + 0x40 + sVar28 * 4);
        fVar136 = *(float *)(uVar37 + 0x80 + sVar28 * 4);
        fVar137 = *(float *)(uVar37 + 0xc0 + sVar28 * 4);
        fVar127 = *(float *)(uVar37 + 0x50 + sVar28 * 4);
        fVar3 = *(float *)(uVar37 + 0x90 + sVar28 * 4);
        fVar139 = *(float *)(uVar37 + 0xd0 + sVar28 * 4);
        fVar94 = *(float *)(uVar37 + 0x60 + sVar28 * 4);
        fVar103 = *(float *)(uVar37 + 0xa0 + sVar28 * 4);
        fVar104 = *(float *)(uVar37 + 0xe0 + sVar28 * 4);
        fVar105 = *(float *)(uVar37 + 0x70 + sVar28 * 4);
        fVar145 = *(float *)(uVar37 + 0xb0 + sVar28 * 4);
        fVar147 = *(float *)(lVar36 + sVar28 * 4);
        uVar19 = *(uint *)(This.ptr + 4);
        uVar12 = *(uint *)(This.ptr + 8);
        uVar13 = *(uint *)(This.ptr + 0xc);
        *puVar30 = ~*(uint *)This.ptr & *puVar30 |
                   (uint)(((fVar147 * fVar55 +
                           fVar145 * fVar83 + fVar105 * fVar79 + fVar134 * fVar77) * fVar39 * 6.0 +
                          (fVar104 * fVar55 + fVar103 * fVar83 + fVar94 * fVar79 + fVar126 * fVar77)
                          * (fVar38 - (fVar39 + fVar39)) * 6.0 +
                          (fVar139 * fVar55 + fVar3 * fVar83 + fVar127 * fVar79 + fVar124 * fVar77)
                          * (fVar39 - (fVar38 + fVar38)) * 6.0 +
                          (fVar137 * fVar55 + fVar136 * fVar83 + fVar135 * fVar79 + fVar122 * fVar77
                          ) * fVar38 * 6.0) * fVar119) & *(uint *)This.ptr;
        puVar30[1] = ~uVar19 & puVar30[1] |
                     (uint)(((fVar147 * fVar62 +
                             fVar145 * fVar87 + fVar105 * fVar121 + fVar134 * fVar81) * fVar46 * 6.0
                            + (fVar104 * fVar62 +
                              fVar103 * fVar87 + fVar94 * fVar121 + fVar126 * fVar81) *
                              (fVar44 - (fVar46 + fVar46)) * 6.0 +
                              (fVar139 * fVar62 +
                              fVar3 * fVar87 + fVar127 * fVar121 + fVar124 * fVar81) *
                              (fVar46 - (fVar44 + fVar44)) * 6.0 +
                              (fVar137 * fVar62 +
                              fVar136 * fVar87 + fVar135 * fVar121 + fVar122 * fVar81) *
                              fVar44 * 6.0) * fVar119) & uVar19;
        puVar30[2] = ~uVar12 & puVar30[2] |
                     (uint)(((fVar147 * fVar63 +
                             fVar145 * fVar91 + fVar105 * fVar123 + fVar134 * fVar85) * fVar49 * 6.0
                            + (fVar104 * fVar63 +
                              fVar103 * fVar91 + fVar94 * fVar123 + fVar126 * fVar85) *
                              (fVar47 - (fVar49 + fVar49)) * 6.0 +
                              (fVar139 * fVar63 +
                              fVar3 * fVar91 + fVar127 * fVar123 + fVar124 * fVar85) *
                              (fVar49 - (fVar47 + fVar47)) * 6.0 +
                              (fVar137 * fVar63 +
                              fVar136 * fVar91 + fVar135 * fVar123 + fVar122 * fVar85) *
                              fVar47 * 6.0) * fVar119) & uVar12;
        puVar30[3] = ~uVar13 & puVar30[3] |
                     (uint)(((fVar147 * fVar64 +
                             fVar145 * fVar120 + fVar105 * fVar125 + fVar134 * fVar89) *
                             fVar53 * 6.0 +
                            (fVar104 * fVar64 +
                            fVar103 * fVar120 + fVar94 * fVar125 + fVar126 * fVar89) *
                            (fVar52 - (fVar53 + fVar53)) * 6.0 +
                            (fVar139 * fVar64 +
                            fVar3 * fVar120 + fVar127 * fVar125 + fVar124 * fVar89) *
                            (fVar53 - (fVar52 + fVar52)) * 6.0 +
                            (fVar137 * fVar64 +
                            fVar136 * fVar120 + fVar135 * fVar125 + fVar122 * fVar89) * fVar52 * 6.0
                            ) * fVar119) & uVar13;
        puVar30 = puVar30 + lVar27;
      }
      fVar39 = (v->field_0).v[0];
      fVar46 = (v->field_0).v[1];
      fVar49 = (v->field_0).v[2];
      fVar53 = (v->field_0).v[3];
      fVar44 = 1.0 - fVar39;
      fVar47 = 1.0 - fVar46;
      fVar52 = 1.0 - fVar49;
      fVar55 = 1.0 - fVar53;
      fVar121 = *(float *)depth;
      fVar123 = *(float *)(depth + 4);
      fVar125 = *(float *)(depth + 8);
      fVar38 = *(float *)(depth + 0xc);
      fVar62 = 1.0 - fVar121;
      fVar64 = 1.0 - fVar123;
      fVar81 = 1.0 - fVar125;
      fVar89 = 1.0 - fVar38;
      fVar63 = fVar62 * 6.0;
      fVar77 = fVar64 * 6.0;
      fVar85 = fVar81 * 6.0;
      fVar79 = fVar89 * 6.0;
      fVar83 = (fVar121 - (fVar62 + fVar62)) * 6.0;
      fVar87 = (fVar123 - (fVar64 + fVar64)) * 6.0;
      fVar91 = (fVar125 - (fVar81 + fVar81)) * 6.0;
      fVar120 = (fVar38 - (fVar89 + fVar89)) * 6.0;
      fVar62 = (fVar62 - (fVar121 + fVar121)) * 6.0;
      fVar64 = (fVar64 - (fVar123 + fVar123)) * 6.0;
      fVar81 = (fVar81 - (fVar125 + fVar125)) * 6.0;
      fVar89 = (fVar89 - (fVar38 + fVar38)) * 6.0;
      fVar121 = fVar121 * 6.0;
      fVar123 = fVar123 * 6.0;
      fVar125 = fVar125 * 6.0;
      fVar38 = fVar38 * 6.0;
      for (sVar28 = 0; RVar25.ptr != sVar28; sVar28 = sVar28 + 1) {
        fVar122 = *(float *)(uVar37 + sVar28 * 4);
        fVar124 = *(float *)(uVar37 + 0x10 + sVar28 * 4);
        fVar126 = *(float *)(uVar37 + 0x20 + sVar28 * 4);
        fVar134 = *(float *)(uVar37 + 0x30 + sVar28 * 4);
        fVar135 = *(float *)(uVar37 + 0x40 + sVar28 * 4);
        fVar136 = *(float *)(uVar37 + 0x80 + sVar28 * 4);
        fVar137 = *(float *)(uVar37 + 0xc0 + sVar28 * 4);
        fVar127 = *(float *)(uVar37 + 0x50 + sVar28 * 4);
        fVar3 = *(float *)(uVar37 + 0x90 + sVar28 * 4);
        fVar139 = *(float *)(uVar37 + 0xd0 + sVar28 * 4);
        fVar94 = *(float *)(uVar37 + 0x60 + sVar28 * 4);
        fVar103 = *(float *)(uVar37 + 0xa0 + sVar28 * 4);
        fVar104 = *(float *)(uVar37 + 0xe0 + sVar28 * 4);
        fVar105 = *(float *)(uVar37 + 0x70 + sVar28 * 4);
        fVar145 = *(float *)(uVar37 + 0xb0 + sVar28 * 4);
        fVar147 = *(float *)(lVar36 + sVar28 * 4);
        uVar19 = *(uint *)(This.ptr + 4);
        uVar12 = *(uint *)(This.ptr + 8);
        uVar13 = *(uint *)(This.ptr + 0xc);
        *puVar29 = ~*(uint *)This.ptr & *puVar29 |
                   (uint)(((fVar147 * fVar121 +
                           fVar145 * fVar62 + fVar105 * fVar83 + fVar134 * fVar63) *
                           fVar39 * fVar39 * fVar39 +
                          (fVar104 * fVar121 + fVar103 * fVar62 + fVar94 * fVar83 + fVar126 * fVar63
                          ) * fVar39 * fVar39 * 3.0 * fVar44 +
                          (fVar139 * fVar121 + fVar3 * fVar62 + fVar127 * fVar83 + fVar124 * fVar63)
                          * fVar39 * 3.0 * fVar44 * fVar44 +
                          (fVar137 * fVar121 +
                          fVar136 * fVar62 + fVar135 * fVar83 + fVar122 * fVar63) *
                          fVar44 * fVar44 * fVar44) * fVar119) & *(uint *)This.ptr;
        puVar29[1] = ~uVar19 & puVar29[1] |
                     (uint)(((fVar147 * fVar123 +
                             fVar145 * fVar64 + fVar105 * fVar87 + fVar134 * fVar77) *
                             fVar46 * fVar46 * fVar46 +
                            (fVar104 * fVar123 +
                            fVar103 * fVar64 + fVar94 * fVar87 + fVar126 * fVar77) *
                            fVar46 * fVar46 * 3.0 * fVar47 +
                            (fVar139 * fVar123 +
                            fVar3 * fVar64 + fVar127 * fVar87 + fVar124 * fVar77) *
                            fVar46 * 3.0 * fVar47 * fVar47 +
                            (fVar137 * fVar123 +
                            fVar136 * fVar64 + fVar135 * fVar87 + fVar122 * fVar77) *
                            fVar47 * fVar47 * fVar47) * fVar119) & uVar19;
        puVar29[2] = ~uVar12 & puVar29[2] |
                     (uint)(((fVar147 * fVar125 +
                             fVar145 * fVar81 + fVar105 * fVar91 + fVar134 * fVar85) *
                             fVar49 * fVar49 * fVar49 +
                            (fVar104 * fVar125 +
                            fVar103 * fVar81 + fVar94 * fVar91 + fVar126 * fVar85) *
                            fVar49 * fVar49 * 3.0 * fVar52 +
                            (fVar139 * fVar125 +
                            fVar3 * fVar81 + fVar127 * fVar91 + fVar124 * fVar85) *
                            fVar49 * 3.0 * fVar52 * fVar52 +
                            (fVar137 * fVar125 +
                            fVar136 * fVar81 + fVar135 * fVar91 + fVar122 * fVar85) *
                            fVar52 * fVar52 * fVar52) * fVar119) & uVar12;
        puVar29[3] = ~uVar13 & puVar29[3] |
                     (uint)(((fVar147 * fVar38 +
                             fVar145 * fVar89 + fVar105 * fVar120 + fVar134 * fVar79) *
                             fVar53 * fVar53 * fVar53 +
                            (fVar104 * fVar38 +
                            fVar103 * fVar89 + fVar94 * fVar120 + fVar126 * fVar79) *
                            fVar53 * fVar53 * 3.0 * fVar55 +
                            (fVar139 * fVar38 +
                            fVar3 * fVar89 + fVar127 * fVar120 + fVar124 * fVar79) *
                            fVar53 * 3.0 * fVar55 * fVar55 +
                            (fVar137 * fVar38 +
                            fVar136 * fVar89 + fVar135 * fVar120 + fVar122 * fVar79) *
                            fVar55 * fVar55 * fVar55) * fVar119) & uVar13;
        puVar29 = puVar29 + lVar27;
      }
      fVar39 = (v->field_0).v[0];
      fVar46 = (v->field_0).v[1];
      fVar49 = (v->field_0).v[2];
      fVar53 = (v->field_0).v[3];
      fVar81 = 1.0 - fVar39;
      fVar85 = 1.0 - fVar46;
      fVar89 = 1.0 - fVar49;
      fVar79 = 1.0 - fVar53;
      fVar83 = fVar39 * fVar81 + fVar39 * fVar81;
      fVar87 = fVar46 * fVar85 + fVar46 * fVar85;
      fVar91 = fVar49 * fVar89 + fVar49 * fVar89;
      fVar120 = fVar53 * fVar79 + fVar53 * fVar79;
      fVar121 = *(float *)depth;
      fVar123 = *(float *)(depth + 4);
      fVar125 = *(float *)(depth + 8);
      fVar38 = *(float *)(depth + 0xc);
      fVar44 = 1.0 - fVar121;
      fVar52 = 1.0 - fVar123;
      fVar62 = 1.0 - fVar125;
      fVar64 = 1.0 - fVar38;
      fVar122 = fVar121 * fVar44 + fVar121 * fVar44;
      fVar124 = fVar123 * fVar52 + fVar123 * fVar52;
      fVar126 = fVar125 * fVar62 + fVar125 * fVar62;
      fVar134 = fVar38 * fVar64 + fVar38 * fVar64;
      fVar47 = fVar44 * fVar44 * -3.0;
      fVar55 = fVar52 * fVar52 * -3.0;
      fVar63 = fVar62 * fVar62 * -3.0;
      fVar77 = fVar64 * fVar64 * -3.0;
      fVar135 = (fVar44 * fVar44 - fVar122) * 3.0;
      fVar136 = (fVar52 * fVar52 - fVar124) * 3.0;
      fVar137 = (fVar62 * fVar62 - fVar126) * 3.0;
      fVar127 = (fVar64 * fVar64 - fVar134) * 3.0;
      fVar44 = (fVar122 - fVar121 * fVar121) * 3.0;
      fVar52 = (fVar124 - fVar123 * fVar123) * 3.0;
      fVar62 = (fVar126 - fVar125 * fVar125) * 3.0;
      fVar64 = (fVar134 - fVar38 * fVar38) * 3.0;
      fVar121 = fVar121 * fVar121 * 3.0;
      fVar123 = fVar123 * fVar123 * 3.0;
      fVar125 = fVar125 * fVar125 * 3.0;
      fVar38 = fVar38 * fVar38 * 3.0;
      for (sVar28 = 0; RVar25.ptr != sVar28; sVar28 = sVar28 + 1) {
        fVar122 = *(float *)(uVar37 + sVar28 * 4);
        fVar124 = *(float *)(uVar37 + 0x10 + sVar28 * 4);
        fVar126 = *(float *)(uVar37 + 0x20 + sVar28 * 4);
        fVar134 = *(float *)(uVar37 + 0x30 + sVar28 * 4);
        fVar3 = *(float *)(uVar37 + 0x40 + sVar28 * 4);
        fVar139 = *(float *)(uVar37 + 0x80 + sVar28 * 4);
        fVar94 = *(float *)(uVar37 + 0xc0 + sVar28 * 4);
        fVar103 = *(float *)(uVar37 + 0x50 + sVar28 * 4);
        fVar104 = *(float *)(uVar37 + 0x90 + sVar28 * 4);
        fVar105 = *(float *)(uVar37 + 0xd0 + sVar28 * 4);
        fVar145 = *(float *)(uVar37 + 0x60 + sVar28 * 4);
        fVar147 = *(float *)(uVar37 + 0xa0 + sVar28 * 4);
        fVar149 = *(float *)(uVar37 + 0xe0 + sVar28 * 4);
        fVar45 = *(float *)(uVar37 + 0x70 + sVar28 * 4);
        fVar48 = *(float *)(uVar37 + 0xb0 + sVar28 * 4);
        fVar40 = *(float *)(lVar36 + sVar28 * 4);
        uVar19 = *(uint *)(This.ptr + 4);
        uVar12 = *(uint *)(This.ptr + 8);
        uVar13 = *(uint *)(This.ptr + 0xc);
        *puVar24 = ~*(uint *)This.ptr & *puVar24 |
                   (uint)(((fVar40 * fVar121 + fVar48 * fVar44 + fVar45 * fVar135 + fVar134 * fVar47
                           ) * fVar39 * fVar39 * 3.0 +
                          (fVar149 * fVar121 +
                          fVar147 * fVar44 + fVar145 * fVar135 + fVar126 * fVar47) *
                          (fVar83 - fVar39 * fVar39) * 3.0 +
                          ((fVar105 * fVar121 +
                           fVar104 * fVar44 + fVar103 * fVar135 + fVar124 * fVar47) *
                           (fVar81 * fVar81 - fVar83) * 3.0 -
                          (fVar94 * fVar121 + fVar139 * fVar44 + fVar3 * fVar135 + fVar122 * fVar47)
                          * fVar81 * fVar81 * 3.0)) * fVar119) & *(uint *)This.ptr;
        puVar24[1] = ~uVar19 & puVar24[1] |
                     (uint)(((fVar40 * fVar123 +
                             fVar48 * fVar52 + fVar45 * fVar136 + fVar134 * fVar55) *
                             fVar46 * fVar46 * 3.0 +
                            (fVar149 * fVar123 +
                            fVar147 * fVar52 + fVar145 * fVar136 + fVar126 * fVar55) *
                            (fVar87 - fVar46 * fVar46) * 3.0 +
                            ((fVar105 * fVar123 +
                             fVar104 * fVar52 + fVar103 * fVar136 + fVar124 * fVar55) *
                             (fVar85 * fVar85 - fVar87) * 3.0 -
                            (fVar94 * fVar123 +
                            fVar139 * fVar52 + fVar3 * fVar136 + fVar122 * fVar55) *
                            fVar85 * fVar85 * 3.0)) * fVar119) & uVar19;
        puVar24[2] = ~uVar12 & puVar24[2] |
                     (uint)(((fVar40 * fVar125 +
                             fVar48 * fVar62 + fVar45 * fVar137 + fVar134 * fVar63) *
                             fVar49 * fVar49 * 3.0 +
                            (fVar149 * fVar125 +
                            fVar147 * fVar62 + fVar145 * fVar137 + fVar126 * fVar63) *
                            (fVar91 - fVar49 * fVar49) * 3.0 +
                            ((fVar105 * fVar125 +
                             fVar104 * fVar62 + fVar103 * fVar137 + fVar124 * fVar63) *
                             (fVar89 * fVar89 - fVar91) * 3.0 -
                            (fVar94 * fVar125 +
                            fVar139 * fVar62 + fVar3 * fVar137 + fVar122 * fVar63) *
                            fVar89 * fVar89 * 3.0)) * fVar119) & uVar12;
        puVar24[3] = ~uVar13 & puVar24[3] |
                     (uint)(((fVar40 * fVar38 +
                             fVar48 * fVar64 + fVar45 * fVar127 + fVar134 * fVar77) *
                             fVar53 * fVar53 * 3.0 +
                            (fVar149 * fVar38 +
                            fVar147 * fVar64 + fVar145 * fVar127 + fVar126 * fVar77) *
                            (fVar120 - fVar53 * fVar53) * 3.0 +
                            ((fVar105 * fVar38 +
                             fVar104 * fVar64 + fVar103 * fVar127 + fVar124 * fVar77) *
                             (fVar79 * fVar79 - fVar120) * 3.0 -
                            (fVar94 * fVar38 + fVar139 * fVar64 + fVar3 * fVar127 + fVar122 * fVar77
                            ) * fVar79 * fVar79 * 3.0)) * fVar119) & uVar13;
        puVar24 = puVar24 + lVar27;
      }
    }
    goto LAB_005cd5fe;
  case 4:
    uVar37 = (ulong)u & 0xfffffffffffffff0;
    puVar33 = *(uint **)&valid->field_0;
    puVar32 = *(uint **)((long)&valid->field_0 + 8);
    puVar31 = *(uint **)&valid[1].field_0;
    puVar30 = *(uint **)((long)&valid[1].field_0 + 8);
    puVar29 = *(uint **)&valid[2].field_0;
    puVar24 = *(uint **)((long)&valid[2].field_0 + 8);
    lVar27 = *(long *)&valid[3].field_0;
    RVar25.ptr = *(size_t *)((long)&valid[3].field_0 + 8);
    if (puVar33 != (uint *)0x0) {
      fVar39 = (v->field_0).v[0];
      fVar46 = (v->field_0).v[1];
      fVar49 = (v->field_0).v[2];
      fVar53 = (v->field_0).v[3];
      fVar38 = 1.0 - fVar39;
      fVar44 = 1.0 - fVar46;
      fVar47 = 1.0 - fVar49;
      fVar52 = 1.0 - fVar53;
      auVar95._0_4_ = fVar39 * 3.0 * fVar38 * fVar38;
      auVar95._4_4_ = fVar46 * 3.0 * fVar44 * fVar44;
      auVar95._8_4_ = fVar49 * 3.0 * fVar47 * fVar47;
      auVar95._12_4_ = fVar53 * 3.0 * fVar52 * fVar52;
      fVar119 = *(float *)depth;
      fVar121 = *(float *)(depth + 4);
      fVar123 = *(float *)(depth + 8);
      fVar125 = *(float *)(depth + 0xc);
      fVar55 = 1.0 - fVar119;
      fVar62 = 1.0 - fVar121;
      fVar63 = 1.0 - fVar123;
      fVar64 = 1.0 - fVar125;
      fVar77 = fVar119 * fVar119 * 3.0 * fVar55;
      fVar81 = fVar121 * fVar121 * 3.0 * fVar62;
      fVar85 = fVar123 * fVar123 * 3.0 * fVar63;
      fVar89 = fVar125 * fVar125 * 3.0 * fVar64;
      in_XMM6._0_4_ = fVar55 * fVar55 * fVar55;
      in_XMM6._4_4_ = fVar62 * fVar62 * fVar62;
      in_XMM6._8_4_ = fVar63 * fVar63 * fVar63;
      in_XMM6._12_4_ = fVar64 * fVar64 * fVar64;
      in_XMM7._0_4_ = fVar119 * 3.0 * fVar55 * fVar55;
      in_XMM7._4_4_ = fVar121 * 3.0 * fVar62 * fVar62;
      in_XMM7._8_4_ = fVar123 * 3.0 * fVar63 * fVar63;
      in_XMM7._12_4_ = fVar125 * 3.0 * fVar64 * fVar64;
      fVar119 = fVar119 * fVar119 * fVar119;
      fVar121 = fVar121 * fVar121 * fVar121;
      fVar123 = fVar123 * fVar123 * fVar123;
      fVar125 = fVar125 * fVar125 * fVar125;
      auVar96 = auVar95;
      for (sVar28 = 0; RVar25.ptr != sVar28; sVar28 = sVar28 + 1) {
        fVar3 = (v->field_0).v[0];
        fVar139 = (v->field_0).v[1];
        fVar94 = (v->field_0).v[2];
        fVar103 = (v->field_0).v[3];
        fVar104 = *(float *)depth;
        fVar105 = *(float *)(depth + 4);
        fVar145 = *(float *)(depth + 8);
        fVar147 = *(float *)(depth + 0xc);
        uVar130 = -(uint)((fVar104 != 0.0 && fVar104 != 1.0) && (fVar3 != 0.0 && fVar3 != 1.0));
        uVar131 = -(uint)((fVar105 != 0.0 && fVar105 != 1.0) && (fVar139 != 0.0 && fVar139 != 1.0));
        uVar132 = -(uint)((fVar145 != 0.0 && fVar145 != 1.0) && (fVar94 != 0.0 && fVar94 != 1.0));
        uVar133 = -(uint)((fVar147 != 0.0 && fVar147 != 1.0) && (fVar103 != 0.0 && fVar103 != 1.0));
        fVar55 = *(float *)(uVar37 + 0x50 + sVar28 * 4);
        fVar62 = *(float *)(uVar37 + 0x60 + sVar28 * 4);
        fVar63 = *(float *)(uVar37 + 0xa0 + sVar28 * 4);
        fVar64 = *(float *)(uVar37 + 0x100 + sVar28 * 4);
        fVar79 = *(float *)(uVar37 + 0x110 + sVar28 * 4);
        fVar78 = 1.0 - fVar3;
        fVar82 = 1.0 - fVar139;
        fVar86 = 1.0 - fVar94;
        fVar90 = 1.0 - fVar103;
        auVar69._0_4_ = fVar3 + fVar104;
        auVar69._4_4_ = fVar139 + fVar105;
        auVar69._8_4_ = fVar94 + fVar145;
        auVar69._12_4_ = fVar103 + fVar147;
        auVar96 = rcpps(auVar96,auVar69);
        fVar50 = auVar96._0_4_;
        fVar54 = auVar96._4_4_;
        fVar67 = auVar96._8_4_;
        fVar80 = auVar96._12_4_;
        fVar68 = 1.0 - fVar104;
        fVar74 = 1.0 - fVar105;
        fVar75 = 1.0 - fVar145;
        fVar76 = 1.0 - fVar147;
        auVar41._0_4_ = fVar79 * fVar78;
        auVar41._4_4_ = fVar79 * fVar82;
        auVar41._8_4_ = fVar79 * fVar86;
        auVar41._12_4_ = fVar79 * fVar90;
        auVar97._0_4_ = fVar78 + fVar104;
        auVar97._4_4_ = fVar82 + fVar105;
        auVar97._8_4_ = fVar86 + fVar145;
        auVar97._12_4_ = fVar90 + fVar147;
        auVar151._0_4_ = fVar104 * fVar62 + auVar41._0_4_;
        auVar151._4_4_ = fVar105 * fVar62 + auVar41._4_4_;
        auVar151._8_4_ = fVar145 * fVar62 + auVar41._8_4_;
        auVar151._12_4_ = fVar147 * fVar62 + auVar41._12_4_;
        auVar96 = rcpps(auVar41,auVar97);
        fVar149 = auVar96._0_4_;
        fVar45 = auVar96._4_4_;
        fVar48 = auVar96._8_4_;
        fVar40 = auVar96._12_4_;
        fVar79 = *(float *)(uVar37 + 0x130 + sVar28 * 4);
        auVar96._0_4_ = fVar79 * fVar68 + fVar78 * fVar63;
        auVar96._4_4_ = fVar79 * fVar74 + fVar82 * fVar63;
        auVar96._8_4_ = fVar79 * fVar75 + fVar86 * fVar63;
        auVar96._12_4_ = fVar79 * fVar76 + fVar90 * fVar63;
        auVar152._4_4_ = fVar82 + fVar74;
        auVar152._0_4_ = fVar78 + fVar68;
        auVar152._8_4_ = fVar86 + fVar75;
        auVar152._12_4_ = fVar90 + fVar76;
        auVar152 = rcpps(auVar151,auVar152);
        fVar84 = auVar152._0_4_;
        fVar92 = auVar152._4_4_;
        fVar65 = auVar152._8_4_;
        fVar106 = auVar152._12_4_;
        fVar79 = *(float *)(uVar37 + 0x90 + sVar28 * 4);
        fVar83 = *(float *)(uVar37 + 0x120 + sVar28 * 4);
        auVar153._0_4_ = fVar83 * fVar3;
        auVar153._4_4_ = fVar83 * fVar139;
        auVar153._8_4_ = fVar83 * fVar94;
        auVar153._12_4_ = fVar83 * fVar103;
        auVar140._0_4_ = fVar3 + fVar68;
        auVar140._4_4_ = fVar139 + fVar74;
        auVar140._8_4_ = fVar94 + fVar75;
        auVar140._12_4_ = fVar103 + fVar76;
        auVar152 = rcpps(auVar153,auVar140);
        fVar88 = auVar152._0_4_;
        fVar93 = auVar152._4_4_;
        fVar66 = auVar152._8_4_;
        fVar110 = auVar152._12_4_;
        fVar83 = *(float *)(uVar37 + 0x80 + sVar28 * 4);
        fVar87 = *(float *)(uVar37 + 0xc0 + sVar28 * 4);
        fVar91 = *(float *)(uVar37 + 0x40 + sVar28 * 4);
        fVar120 = *(float *)(uVar37 + sVar28 * 4);
        fVar122 = *(float *)(uVar37 + 0xd0 + sVar28 * 4);
        fVar124 = *(float *)(uVar37 + 0x10 + sVar28 * 4);
        fVar126 = *(float *)(uVar37 + 0xe0 + sVar28 * 4);
        fVar134 = *(float *)(uVar37 + 0x20 + sVar28 * 4);
        fVar135 = *(float *)(uVar37 + 0xb0 + sVar28 * 4);
        fVar136 = *(float *)(uVar37 + 0xf0 + sVar28 * 4);
        fVar137 = *(float *)(uVar37 + 0x70 + sVar28 * 4);
        fVar127 = *(float *)(uVar37 + 0x30 + sVar28 * 4);
        uVar19 = *(uint *)(This.ptr + 4);
        uVar12 = *(uint *)(This.ptr + 8);
        uVar13 = *(uint *)(This.ptr + 0xc);
        *puVar33 = ~*(uint *)This.ptr & *puVar33 |
                   (uint)((fVar127 * in_XMM6._0_4_ +
                          fVar137 * in_XMM7._0_4_ + fVar135 * fVar77 + fVar136 * fVar119) *
                          fVar39 * fVar39 * fVar39 +
                          (fVar134 * in_XMM6._0_4_ +
                          (float)(~uVar130 & (uint)fVar62 |
                                 (uint)(((1.0 - auVar97._0_4_ * fVar149) * fVar149 + fVar149) *
                                       auVar151._0_4_) & uVar130) * in_XMM7._0_4_ +
                          (float)(~uVar130 & (uint)fVar63 |
                                 (uint)(((1.0 - (fVar78 + fVar68) * fVar84) * fVar84 + fVar84) *
                                       auVar96._0_4_) & uVar130) * fVar77 + fVar126 * fVar119) *
                          fVar39 * fVar39 * 3.0 * fVar38 +
                          (fVar124 * in_XMM6._0_4_ +
                          (float)(~uVar130 & (uint)fVar55 |
                                 (uint)(((1.0 - auVar69._0_4_ * fVar50) * fVar50 + fVar50) *
                                       (fVar64 * fVar104 + fVar3 * fVar55)) & uVar130) *
                          in_XMM7._0_4_ +
                          (float)(~uVar130 & (uint)fVar79 |
                                 (uint)(((1.0 - auVar140._0_4_ * fVar88) * fVar88 + fVar88) *
                                       (fVar68 * fVar79 + auVar153._0_4_)) & uVar130) * fVar77 +
                          fVar122 * fVar119) * auVar95._0_4_ +
                         (fVar120 * in_XMM6._0_4_ +
                         fVar91 * in_XMM7._0_4_ + fVar83 * fVar77 + fVar87 * fVar119) *
                         fVar38 * fVar38 * fVar38) & *(uint *)This.ptr;
        puVar33[1] = ~uVar19 & puVar33[1] |
                     (uint)((fVar127 * in_XMM6._4_4_ +
                            fVar137 * in_XMM7._4_4_ + fVar135 * fVar81 + fVar136 * fVar121) *
                            fVar46 * fVar46 * fVar46 +
                            (fVar134 * in_XMM6._4_4_ +
                            (float)(~uVar131 & (uint)fVar62 |
                                   (uint)(((1.0 - auVar97._4_4_ * fVar45) * fVar45 + fVar45) *
                                         auVar151._4_4_) & uVar131) * in_XMM7._4_4_ +
                            (float)(~uVar131 & (uint)fVar63 |
                                   (uint)(((1.0 - (fVar82 + fVar74) * fVar92) * fVar92 + fVar92) *
                                         auVar96._4_4_) & uVar131) * fVar81 + fVar126 * fVar121) *
                            fVar46 * fVar46 * 3.0 * fVar44 +
                            (fVar124 * in_XMM6._4_4_ +
                            (float)(~uVar131 & (uint)fVar55 |
                                   (uint)(((1.0 - auVar69._4_4_ * fVar54) * fVar54 + fVar54) *
                                         (fVar64 * fVar105 + fVar139 * fVar55)) & uVar131) *
                            in_XMM7._4_4_ +
                            (float)(~uVar131 & (uint)fVar79 |
                                   (uint)(((1.0 - auVar140._4_4_ * fVar93) * fVar93 + fVar93) *
                                         (fVar74 * fVar79 + auVar153._4_4_)) & uVar131) * fVar81 +
                            fVar122 * fVar121) * auVar95._4_4_ +
                           (fVar120 * in_XMM6._4_4_ +
                           fVar91 * in_XMM7._4_4_ + fVar83 * fVar81 + fVar87 * fVar121) *
                           fVar44 * fVar44 * fVar44) & uVar19;
        puVar33[2] = ~uVar12 & puVar33[2] |
                     (uint)((fVar127 * in_XMM6._8_4_ +
                            fVar137 * in_XMM7._8_4_ + fVar135 * fVar85 + fVar136 * fVar123) *
                            fVar49 * fVar49 * fVar49 +
                            (fVar134 * in_XMM6._8_4_ +
                            (float)(~uVar132 & (uint)fVar62 |
                                   (uint)(((1.0 - auVar97._8_4_ * fVar48) * fVar48 + fVar48) *
                                         auVar151._8_4_) & uVar132) * in_XMM7._8_4_ +
                            (float)(~uVar132 & (uint)fVar63 |
                                   (uint)(((1.0 - (fVar86 + fVar75) * fVar65) * fVar65 + fVar65) *
                                         auVar96._8_4_) & uVar132) * fVar85 + fVar126 * fVar123) *
                            fVar49 * fVar49 * 3.0 * fVar47 +
                            (fVar124 * in_XMM6._8_4_ +
                            (float)(~uVar132 & (uint)fVar55 |
                                   (uint)(((1.0 - auVar69._8_4_ * fVar67) * fVar67 + fVar67) *
                                         (fVar64 * fVar145 + fVar94 * fVar55)) & uVar132) *
                            in_XMM7._8_4_ +
                            (float)(~uVar132 & (uint)fVar79 |
                                   (uint)(((1.0 - auVar140._8_4_ * fVar66) * fVar66 + fVar66) *
                                         (fVar75 * fVar79 + auVar153._8_4_)) & uVar132) * fVar85 +
                            fVar122 * fVar123) * auVar95._8_4_ +
                           (fVar120 * in_XMM6._8_4_ +
                           fVar91 * in_XMM7._8_4_ + fVar83 * fVar85 + fVar87 * fVar123) *
                           fVar47 * fVar47 * fVar47) & uVar12;
        puVar33[3] = ~uVar13 & puVar33[3] |
                     (uint)((fVar127 * in_XMM6._12_4_ +
                            fVar137 * in_XMM7._12_4_ + fVar135 * fVar89 + fVar136 * fVar125) *
                            fVar53 * fVar53 * fVar53 +
                            (fVar134 * in_XMM6._12_4_ +
                            (float)(~uVar133 & (uint)fVar62 |
                                   (uint)(((1.0 - auVar97._12_4_ * fVar40) * fVar40 + fVar40) *
                                         auVar151._12_4_) & uVar133) * in_XMM7._12_4_ +
                            (float)(~uVar133 & (uint)fVar63 |
                                   (uint)(((1.0 - (fVar90 + fVar76) * fVar106) * fVar106 + fVar106)
                                         * auVar96._12_4_) & uVar133) * fVar89 + fVar126 * fVar125)
                            * fVar53 * fVar53 * 3.0 * fVar52 +
                            (fVar124 * in_XMM6._12_4_ +
                            (float)(~uVar133 & (uint)fVar55 |
                                   (uint)(((1.0 - auVar69._12_4_ * fVar80) * fVar80 + fVar80) *
                                         (fVar64 * fVar147 + fVar103 * fVar55)) & uVar133) *
                            in_XMM7._12_4_ +
                            (float)(~uVar133 & (uint)fVar79 |
                                   (uint)(((1.0 - auVar140._12_4_ * fVar110) * fVar110 + fVar110) *
                                         (fVar76 * fVar79 + auVar153._12_4_)) & uVar133) * fVar89 +
                            fVar122 * fVar125) * auVar95._12_4_ +
                           (fVar120 * in_XMM6._12_4_ +
                           fVar91 * in_XMM7._12_4_ + fVar83 * fVar89 + fVar87 * fVar125) *
                           fVar52 * fVar52 * fVar52) & uVar13;
        puVar33 = puVar33 + lVar27;
      }
    }
    if (puVar32 != (uint *)0x0) {
      fVar39 = (v->field_0).v[0];
      fVar46 = (v->field_0).v[1];
      fVar49 = (v->field_0).v[2];
      fVar53 = (v->field_0).v[3];
      fVar77 = 1.0 - fVar39;
      fVar81 = 1.0 - fVar46;
      fVar85 = 1.0 - fVar49;
      fVar89 = 1.0 - fVar53;
      fVar79 = fVar39 * fVar77 + fVar39 * fVar77;
      fVar83 = fVar46 * fVar81 + fVar46 * fVar81;
      fVar87 = fVar49 * fVar85 + fVar49 * fVar85;
      fVar91 = fVar53 * fVar89 + fVar53 * fVar89;
      auVar98._0_4_ = (fVar77 * fVar77 - fVar79) * 3.0;
      auVar98._4_4_ = (fVar81 * fVar81 - fVar83) * 3.0;
      auVar98._8_4_ = (fVar85 * fVar85 - fVar87) * 3.0;
      auVar98._12_4_ = (fVar89 * fVar89 - fVar91) * 3.0;
      fVar119 = *(float *)depth;
      fVar121 = *(float *)(depth + 4);
      fVar123 = *(float *)(depth + 8);
      fVar125 = *(float *)(depth + 0xc);
      fVar38 = 1.0 - fVar119;
      fVar44 = 1.0 - fVar121;
      fVar47 = 1.0 - fVar123;
      fVar52 = 1.0 - fVar125;
      fVar120 = fVar119 * fVar119 * fVar119;
      fVar122 = fVar121 * fVar121 * fVar121;
      fVar124 = fVar123 * fVar123 * fVar123;
      fVar126 = fVar125 * fVar125 * fVar125;
      fVar134 = fVar119 * fVar119 * 3.0 * fVar38;
      fVar135 = fVar121 * fVar121 * 3.0 * fVar44;
      fVar136 = fVar123 * fVar123 * 3.0 * fVar47;
      fVar137 = fVar125 * fVar125 * 3.0 * fVar52;
      fVar55 = fVar38 * fVar38 * fVar38;
      fVar62 = fVar44 * fVar44 * fVar44;
      fVar63 = fVar47 * fVar47 * fVar47;
      fVar64 = fVar52 * fVar52 * fVar52;
      fVar119 = fVar119 * 3.0 * fVar38 * fVar38;
      fVar121 = fVar121 * 3.0 * fVar44 * fVar44;
      fVar123 = fVar123 * 3.0 * fVar47 * fVar47;
      fVar125 = fVar125 * 3.0 * fVar52 * fVar52;
      sVar28 = 0;
      auVar99 = auVar98;
      while( true ) {
        fVar38 = (v->field_0).v[0];
        fVar44 = (v->field_0).v[1];
        fVar47 = (v->field_0).v[2];
        fVar52 = (v->field_0).v[3];
        if (RVar25.ptr == sVar28) break;
        fVar76 = *(float *)depth;
        fVar78 = *(float *)(depth + 4);
        fVar82 = *(float *)(depth + 8);
        fVar86 = *(float *)(depth + 0xc);
        uVar130 = -(uint)((fVar76 != 0.0 && fVar76 != 1.0) && (fVar38 != 1.0 && fVar38 != 0.0));
        uVar131 = -(uint)((fVar78 != 0.0 && fVar78 != 1.0) && (fVar44 != 1.0 && fVar44 != 0.0));
        uVar132 = -(uint)((fVar82 != 0.0 && fVar82 != 1.0) && (fVar47 != 1.0 && fVar47 != 0.0));
        uVar133 = -(uint)((fVar86 != 0.0 && fVar86 != 1.0) && (fVar52 != 1.0 && fVar52 != 0.0));
        fVar127 = *(float *)(uVar37 + 0x50 + sVar28 * 4);
        fVar3 = *(float *)(uVar37 + 0x60 + sVar28 * 4);
        fVar139 = *(float *)(uVar37 + 0xa0 + sVar28 * 4);
        fVar94 = *(float *)(uVar37 + 0x100 + sVar28 * 4);
        fVar103 = *(float *)(uVar37 + 0x110 + sVar28 * 4);
        fVar138 = 1.0 - fVar38;
        fVar144 = 1.0 - fVar44;
        fVar146 = 1.0 - fVar47;
        fVar148 = 1.0 - fVar52;
        auVar113._0_4_ = fVar94 * fVar76 + fVar38 * fVar127;
        auVar113._4_4_ = fVar94 * fVar78 + fVar44 * fVar127;
        auVar113._8_4_ = fVar94 * fVar82 + fVar47 * fVar127;
        auVar113._12_4_ = fVar94 * fVar86 + fVar52 * fVar127;
        auVar9._4_4_ = fVar44 + fVar78;
        auVar9._0_4_ = fVar38 + fVar76;
        auVar9._8_4_ = fVar47 + fVar82;
        auVar9._12_4_ = fVar52 + fVar86;
        auVar96 = rcpps(auVar99,auVar9);
        fVar93 = auVar96._0_4_;
        fVar65 = auVar96._4_4_;
        fVar66 = auVar96._8_4_;
        fVar106 = auVar96._12_4_;
        fVar80 = 1.0 - fVar76;
        fVar84 = 1.0 - fVar78;
        fVar88 = 1.0 - fVar82;
        fVar92 = 1.0 - fVar86;
        auVar100._0_4_ = fVar138 + fVar76;
        auVar100._4_4_ = fVar144 + fVar78;
        auVar100._8_4_ = fVar146 + fVar82;
        auVar100._12_4_ = fVar148 + fVar86;
        auVar96 = rcpps(auVar113,auVar100);
        fVar110 = auVar96._0_4_;
        fVar111 = auVar96._4_4_;
        fVar112 = auVar96._8_4_;
        fVar156 = auVar96._12_4_;
        fVar94 = *(float *)(uVar37 + 0x130 + sVar28 * 4);
        auVar56._0_4_ = fVar138 * fVar139;
        auVar56._4_4_ = fVar144 * fVar139;
        auVar56._8_4_ = fVar146 * fVar139;
        auVar56._12_4_ = fVar148 * fVar139;
        auVar141._0_4_ = fVar138 + fVar80;
        auVar141._4_4_ = fVar144 + fVar84;
        auVar141._8_4_ = fVar146 + fVar88;
        auVar141._12_4_ = fVar148 + fVar92;
        auVar96 = rcpps(auVar56,auVar141);
        fVar145 = auVar96._0_4_;
        fVar147 = auVar96._4_4_;
        fVar149 = auVar96._8_4_;
        fVar45 = auVar96._12_4_;
        fVar104 = *(float *)(uVar37 + 0x90 + sVar28 * 4);
        fVar105 = *(float *)(uVar37 + 0x120 + sVar28 * 4);
        auVar57._0_4_ = fVar105 * fVar38;
        auVar57._4_4_ = fVar105 * fVar44;
        auVar57._8_4_ = fVar105 * fVar47;
        auVar57._12_4_ = fVar105 * fVar52;
        auVar70._0_4_ = fVar38 + fVar80;
        auVar70._4_4_ = fVar44 + fVar84;
        auVar70._8_4_ = fVar47 + fVar88;
        auVar70._12_4_ = fVar52 + fVar92;
        auVar96 = rcpps(auVar57,auVar70);
        fVar90 = auVar96._0_4_;
        fVar50 = auVar96._4_4_;
        fVar54 = auVar96._8_4_;
        fVar67 = auVar96._12_4_;
        auVar154._0_4_ = ~uVar130 & (uint)fVar139;
        auVar154._4_4_ = ~uVar131 & (uint)fVar139;
        auVar154._8_4_ = ~uVar132 & (uint)fVar139;
        auVar154._12_4_ = ~uVar133 & (uint)fVar139;
        in_XMM7._0_4_ =
             (float)((uint)(((1.0 - auVar141._0_4_ * fVar145) * fVar145 + fVar145) *
                           (fVar94 * fVar80 + auVar56._0_4_)) & uVar130);
        in_XMM7._4_4_ =
             (float)((uint)(((1.0 - auVar141._4_4_ * fVar147) * fVar147 + fVar147) *
                           (fVar94 * fVar84 + auVar56._4_4_)) & uVar131);
        in_XMM7._8_4_ =
             (float)((uint)(((1.0 - auVar141._8_4_ * fVar149) * fVar149 + fVar149) *
                           (fVar94 * fVar88 + auVar56._8_4_)) & uVar132);
        in_XMM7._12_4_ =
             (float)((uint)(((1.0 - auVar141._12_4_ * fVar45) * fVar45 + fVar45) *
                           (fVar94 * fVar92 + auVar56._12_4_)) & uVar133);
        auVar154 = auVar154 | in_XMM7;
        fVar139 = *(float *)(uVar37 + 0x80 + sVar28 * 4);
        fVar94 = *(float *)(uVar37 + 0xc0 + sVar28 * 4);
        fVar105 = *(float *)(uVar37 + 0x40 + sVar28 * 4);
        fVar145 = *(float *)(uVar37 + sVar28 * 4);
        auVar99._4_4_ = fVar62;
        auVar99._0_4_ = fVar55;
        auVar99._8_4_ = fVar63;
        auVar99._12_4_ = fVar64;
        fVar147 = *(float *)(uVar37 + 0xd0 + sVar28 * 4);
        fVar149 = *(float *)(uVar37 + 0x10 + sVar28 * 4);
        fVar45 = *(float *)(uVar37 + 0xe0 + sVar28 * 4);
        fVar48 = *(float *)(uVar37 + 0x20 + sVar28 * 4);
        fVar40 = *(float *)(uVar37 + 0xb0 + sVar28 * 4);
        fVar68 = *(float *)(uVar37 + 0xf0 + sVar28 * 4);
        fVar74 = *(float *)(uVar37 + 0x70 + sVar28 * 4);
        fVar75 = *(float *)(uVar37 + 0x30 + sVar28 * 4);
        uVar19 = *(uint *)(This.ptr + 4);
        uVar12 = *(uint *)(This.ptr + 8);
        uVar13 = *(uint *)(This.ptr + 0xc);
        *puVar32 = ~*(uint *)This.ptr & *puVar32 |
                   (uint)((((fVar75 * fVar55 +
                            fVar74 * fVar119 + fVar40 * fVar134 + fVar68 * fVar120) *
                            fVar39 * fVar39 * 3.0 +
                            (fVar48 * fVar55 +
                            (float)(~uVar130 & (uint)fVar3 |
                                   (uint)(((1.0 - auVar100._0_4_ * fVar110) * fVar110 + fVar110) *
                                         (fVar76 * fVar3 + fVar103 * fVar138)) & uVar130) * fVar119
                            + auVar154._0_4_ * fVar134 + fVar45 * fVar120) *
                            (fVar79 - fVar39 * fVar39) * 3.0 +
                           (fVar149 * fVar55 +
                           (float)(~uVar130 & (uint)fVar127 |
                                  (uint)(((1.0 - (fVar38 + fVar76) * fVar93) * fVar93 + fVar93) *
                                        auVar113._0_4_) & uVar130) * fVar119 +
                           (float)(~uVar130 & (uint)fVar104 |
                                  (uint)(((1.0 - auVar70._0_4_ * fVar90) * fVar90 + fVar90) *
                                        (fVar80 * fVar104 + auVar57._0_4_)) & uVar130) * fVar134 +
                           fVar147 * fVar120) * auVar98._0_4_) -
                          (fVar145 * fVar55 +
                          fVar105 * fVar119 + fVar139 * fVar134 + fVar94 * fVar120) *
                          fVar77 * fVar77 * 3.0) * dscale) & *(uint *)This.ptr;
        puVar32[1] = ~uVar19 & puVar32[1] |
                     (uint)((((fVar75 * fVar62 +
                              fVar74 * fVar121 + fVar40 * fVar135 + fVar68 * fVar122) *
                              fVar46 * fVar46 * 3.0 +
                              (fVar48 * fVar62 +
                              (float)(~uVar131 & (uint)fVar3 |
                                     (uint)(((1.0 - auVar100._4_4_ * fVar111) * fVar111 + fVar111) *
                                           (fVar78 * fVar3 + fVar103 * fVar144)) & uVar131) *
                              fVar121 + auVar154._4_4_ * fVar135 + fVar45 * fVar122) *
                              (fVar83 - fVar46 * fVar46) * 3.0 +
                             (fVar149 * fVar62 +
                             (float)(~uVar131 & (uint)fVar127 |
                                    (uint)(((1.0 - (fVar44 + fVar78) * fVar65) * fVar65 + fVar65) *
                                          auVar113._4_4_) & uVar131) * fVar121 +
                             (float)(~uVar131 & (uint)fVar104 |
                                    (uint)(((1.0 - auVar70._4_4_ * fVar50) * fVar50 + fVar50) *
                                          (fVar84 * fVar104 + auVar57._4_4_)) & uVar131) * fVar135 +
                             fVar147 * fVar122) * auVar98._4_4_) -
                            (fVar145 * fVar62 +
                            fVar105 * fVar121 + fVar139 * fVar135 + fVar94 * fVar122) *
                            fVar81 * fVar81 * 3.0) * dscale) & uVar19;
        puVar32[2] = ~uVar12 & puVar32[2] |
                     (uint)((((fVar75 * fVar63 +
                              fVar74 * fVar123 + fVar40 * fVar136 + fVar68 * fVar124) *
                              fVar49 * fVar49 * 3.0 +
                              (fVar48 * fVar63 +
                              (float)(~uVar132 & (uint)fVar3 |
                                     (uint)(((1.0 - auVar100._8_4_ * fVar112) * fVar112 + fVar112) *
                                           (fVar82 * fVar3 + fVar103 * fVar146)) & uVar132) *
                              fVar123 + auVar154._8_4_ * fVar136 + fVar45 * fVar124) *
                              (fVar87 - fVar49 * fVar49) * 3.0 +
                             (fVar149 * fVar63 +
                             (float)(~uVar132 & (uint)fVar127 |
                                    (uint)(((1.0 - (fVar47 + fVar82) * fVar66) * fVar66 + fVar66) *
                                          auVar113._8_4_) & uVar132) * fVar123 +
                             (float)(~uVar132 & (uint)fVar104 |
                                    (uint)(((1.0 - auVar70._8_4_ * fVar54) * fVar54 + fVar54) *
                                          (fVar88 * fVar104 + auVar57._8_4_)) & uVar132) * fVar136 +
                             fVar147 * fVar124) * auVar98._8_4_) -
                            (fVar145 * fVar63 +
                            fVar105 * fVar123 + fVar139 * fVar136 + fVar94 * fVar124) *
                            fVar85 * fVar85 * 3.0) * dscale) & uVar12;
        puVar32[3] = ~uVar13 & puVar32[3] |
                     (uint)((((fVar75 * fVar64 +
                              fVar74 * fVar125 + fVar40 * fVar137 + fVar68 * fVar126) *
                              fVar53 * fVar53 * 3.0 +
                              (fVar48 * fVar64 +
                              (float)(~uVar133 & (uint)fVar3 |
                                     (uint)(((1.0 - auVar100._12_4_ * fVar156) * fVar156 + fVar156)
                                           * (fVar86 * fVar3 + fVar103 * fVar148)) & uVar133) *
                              fVar125 + auVar154._12_4_ * fVar137 + fVar45 * fVar126) *
                              (fVar91 - fVar53 * fVar53) * 3.0 +
                             (fVar149 * fVar64 +
                             (float)(~uVar133 & (uint)fVar127 |
                                    (uint)(((1.0 - (fVar52 + fVar86) * fVar106) * fVar106 + fVar106)
                                          * auVar113._12_4_) & uVar133) * fVar125 +
                             (float)(~uVar133 & (uint)fVar104 |
                                    (uint)(((1.0 - auVar70._12_4_ * fVar67) * fVar67 + fVar67) *
                                          (fVar92 * fVar104 + auVar57._12_4_)) & uVar133) * fVar137
                             + fVar147 * fVar126) * auVar98._12_4_) -
                            (fVar145 * fVar64 +
                            fVar105 * fVar125 + fVar139 * fVar137 + fVar94 * fVar126) *
                            fVar89 * fVar89 * 3.0) * dscale) & uVar13;
        sVar28 = sVar28 + 1;
        puVar32 = puVar32 + lVar27;
      }
      fVar119 = 1.0 - fVar38;
      fVar121 = 1.0 - fVar44;
      fVar123 = 1.0 - fVar47;
      fVar125 = 1.0 - fVar52;
      auVar107._0_4_ = fVar38 * fVar38 * 3.0 * fVar119;
      auVar107._4_4_ = fVar44 * fVar44 * 3.0 * fVar121;
      auVar107._8_4_ = fVar47 * fVar47 * 3.0 * fVar123;
      auVar107._12_4_ = fVar52 * fVar52 * 3.0 * fVar125;
      fVar39 = *(float *)depth;
      fVar46 = *(float *)(depth + 4);
      fVar49 = *(float *)(depth + 8);
      fVar53 = *(float *)(depth + 0xc);
      fVar55 = 1.0 - fVar39;
      fVar63 = 1.0 - fVar46;
      fVar77 = 1.0 - fVar49;
      fVar85 = 1.0 - fVar53;
      fVar79 = fVar39 * fVar55 + fVar39 * fVar55;
      fVar83 = fVar46 * fVar63 + fVar46 * fVar63;
      fVar87 = fVar49 * fVar77 + fVar49 * fVar77;
      fVar91 = fVar53 * fVar85 + fVar53 * fVar85;
      fVar62 = fVar55 * fVar55 * -3.0;
      fVar64 = fVar63 * fVar63 * -3.0;
      fVar81 = fVar77 * fVar77 * -3.0;
      fVar89 = fVar85 * fVar85 * -3.0;
      fVar55 = (fVar55 * fVar55 - fVar79) * 3.0;
      fVar63 = (fVar63 * fVar63 - fVar83) * 3.0;
      fVar77 = (fVar77 * fVar77 - fVar87) * 3.0;
      fVar85 = (fVar85 * fVar85 - fVar91) * 3.0;
      fVar79 = (fVar79 - fVar39 * fVar39) * 3.0;
      fVar83 = (fVar83 - fVar46 * fVar46) * 3.0;
      fVar87 = (fVar87 - fVar49 * fVar49) * 3.0;
      fVar91 = (fVar91 - fVar53 * fVar53) * 3.0;
      fVar39 = fVar39 * fVar39 * 3.0;
      fVar46 = fVar46 * fVar46 * 3.0;
      fVar49 = fVar49 * fVar49 * 3.0;
      fVar53 = fVar53 * fVar53 * 3.0;
      in_XMM6 = auVar107;
      for (sVar28 = 0; RVar25.ptr != sVar28; sVar28 = sVar28 + 1) {
        fVar48 = (v->field_0).v[0];
        fVar40 = (v->field_0).v[1];
        fVar68 = (v->field_0).v[2];
        fVar74 = (v->field_0).v[3];
        fVar75 = *(float *)depth;
        fVar76 = *(float *)(depth + 4);
        fVar78 = *(float *)(depth + 8);
        fVar82 = *(float *)(depth + 0xc);
        uVar130 = -(uint)((fVar75 != 0.0 && fVar75 != 1.0) && (fVar48 != 1.0 && fVar48 != 0.0));
        uVar131 = -(uint)((fVar76 != 0.0 && fVar76 != 1.0) && (fVar40 != 1.0 && fVar40 != 0.0));
        uVar132 = -(uint)((fVar78 != 0.0 && fVar78 != 1.0) && (fVar68 != 1.0 && fVar68 != 0.0));
        uVar133 = -(uint)((fVar82 != 0.0 && fVar82 != 1.0) && (fVar74 != 1.0 && fVar74 != 0.0));
        fVar120 = *(float *)(uVar37 + 0x50 + sVar28 * 4);
        fVar122 = *(float *)(uVar37 + 0x60 + sVar28 * 4);
        fVar124 = *(float *)(uVar37 + 0xa0 + sVar28 * 4);
        fVar126 = *(float *)(uVar37 + 0x100 + sVar28 * 4);
        fVar134 = *(float *)(uVar37 + 0x110 + sVar28 * 4);
        fVar86 = 1.0 - fVar48;
        fVar90 = 1.0 - fVar40;
        fVar50 = 1.0 - fVar68;
        fVar54 = 1.0 - fVar74;
        auVar108._0_4_ = fVar48 + fVar75;
        auVar108._4_4_ = fVar40 + fVar76;
        auVar108._8_4_ = fVar68 + fVar78;
        auVar108._12_4_ = fVar74 + fVar82;
        auVar96 = rcpps(in_XMM7,auVar108);
        fVar156 = auVar96._0_4_;
        fVar144 = auVar96._4_4_;
        fVar148 = auVar96._8_4_;
        fVar117 = auVar96._12_4_;
        fVar106 = 1.0 - fVar75;
        fVar110 = 1.0 - fVar76;
        fVar111 = 1.0 - fVar78;
        fVar112 = 1.0 - fVar82;
        auVar10._4_4_ = fVar90 + fVar76;
        auVar10._0_4_ = fVar86 + fVar75;
        auVar10._8_4_ = fVar50 + fVar78;
        auVar10._12_4_ = fVar54 + fVar82;
        auVar96 = rcpps(auVar96,auVar10);
        fVar138 = auVar96._0_4_;
        fVar146 = auVar96._4_4_;
        fVar116 = auVar96._8_4_;
        fVar118 = auVar96._12_4_;
        fVar135 = *(float *)(uVar37 + 0x130 + sVar28 * 4);
        auVar58._0_4_ = fVar86 * fVar124;
        auVar58._4_4_ = fVar90 * fVar124;
        auVar58._8_4_ = fVar50 * fVar124;
        auVar58._12_4_ = fVar54 * fVar124;
        auVar42._0_4_ = fVar86 + fVar106;
        auVar42._4_4_ = fVar90 + fVar110;
        auVar42._8_4_ = fVar50 + fVar111;
        auVar42._12_4_ = fVar54 + fVar112;
        auVar96 = rcpps(auVar58,auVar42);
        fVar67 = auVar96._0_4_;
        fVar84 = auVar96._4_4_;
        fVar92 = auVar96._8_4_;
        fVar65 = auVar96._12_4_;
        fVar136 = *(float *)(uVar37 + 0x90 + sVar28 * 4);
        fVar137 = *(float *)(uVar37 + 0x120 + sVar28 * 4);
        auVar59._0_4_ = fVar137 * fVar48;
        auVar59._4_4_ = fVar137 * fVar40;
        auVar59._8_4_ = fVar137 * fVar68;
        auVar59._12_4_ = fVar137 * fVar74;
        auVar150._0_4_ = fVar48 + fVar106;
        auVar150._4_4_ = fVar40 + fVar110;
        auVar150._8_4_ = fVar68 + fVar111;
        auVar150._12_4_ = fVar74 + fVar112;
        auVar96 = rcpps(auVar59,auVar150);
        fVar80 = auVar96._0_4_;
        fVar88 = auVar96._4_4_;
        fVar93 = auVar96._8_4_;
        fVar66 = auVar96._12_4_;
        fVar137 = *(float *)(uVar37 + 0x80 + sVar28 * 4);
        fVar127 = *(float *)(uVar37 + 0xc0 + sVar28 * 4);
        fVar3 = *(float *)(uVar37 + 0x40 + sVar28 * 4);
        in_XMM7._4_4_ = fVar63;
        in_XMM7._0_4_ = fVar55;
        in_XMM7._8_4_ = fVar77;
        in_XMM7._12_4_ = fVar85;
        fVar139 = *(float *)(uVar37 + sVar28 * 4);
        in_XMM6._4_4_ = fVar64;
        in_XMM6._0_4_ = fVar62;
        in_XMM6._8_4_ = fVar81;
        in_XMM6._12_4_ = fVar89;
        fVar94 = *(float *)(uVar37 + 0xd0 + sVar28 * 4);
        fVar103 = *(float *)(uVar37 + 0x10 + sVar28 * 4);
        fVar104 = *(float *)(uVar37 + 0xe0 + sVar28 * 4);
        fVar105 = *(float *)(uVar37 + 0x20 + sVar28 * 4);
        fVar145 = *(float *)(uVar37 + 0xb0 + sVar28 * 4);
        fVar147 = *(float *)(uVar37 + 0xf0 + sVar28 * 4);
        fVar149 = *(float *)(uVar37 + 0x70 + sVar28 * 4);
        fVar45 = *(float *)(uVar37 + 0x30 + sVar28 * 4);
        uVar19 = *(uint *)(This.ptr + 4);
        uVar12 = *(uint *)(This.ptr + 8);
        uVar13 = *(uint *)(This.ptr + 0xc);
        *puVar31 = ~*(uint *)This.ptr & *puVar31 |
                   (uint)(((fVar45 * fVar62 + fVar149 * fVar55 + fVar145 * fVar79 + fVar147 * fVar39
                           ) * fVar38 * fVar38 * fVar38 +
                           (fVar105 * fVar62 +
                           (float)(~uVar130 & (uint)fVar122 |
                                  (uint)(((1.0 - (fVar86 + fVar75) * fVar138) * fVar138 + fVar138) *
                                        (fVar75 * fVar122 + fVar134 * fVar86)) & uVar130) * fVar55 +
                           (float)(~uVar130 & (uint)fVar124 |
                                  (uint)(((1.0 - auVar42._0_4_ * fVar67) * fVar67 + fVar67) *
                                        (fVar135 * fVar106 + auVar58._0_4_)) & uVar130) * fVar79 +
                           fVar104 * fVar39) * auVar107._0_4_ +
                           (fVar103 * fVar62 +
                           (float)(~uVar130 & (uint)fVar120 |
                                  (uint)(((1.0 - auVar108._0_4_ * fVar156) * fVar156 + fVar156) *
                                        (fVar126 * fVar75 + fVar48 * fVar120)) & uVar130) * fVar55 +
                           (float)(~uVar130 & (uint)fVar136 |
                                  (uint)(((1.0 - auVar150._0_4_ * fVar80) * fVar80 + fVar80) *
                                        (fVar106 * fVar136 + auVar59._0_4_)) & uVar130) * fVar79 +
                           fVar94 * fVar39) * fVar38 * 3.0 * fVar119 * fVar119 +
                          (fVar139 * fVar62 + fVar3 * fVar55 + fVar137 * fVar79 + fVar127 * fVar39)
                          * fVar119 * fVar119 * fVar119) * dscale) & *(uint *)This.ptr;
        puVar31[1] = ~uVar19 & puVar31[1] |
                     (uint)(((fVar45 * fVar64 +
                             fVar149 * fVar63 + fVar145 * fVar83 + fVar147 * fVar46) *
                             fVar44 * fVar44 * fVar44 +
                             (fVar105 * fVar64 +
                             (float)(~uVar131 & (uint)fVar122 |
                                    (uint)(((1.0 - (fVar90 + fVar76) * fVar146) * fVar146 + fVar146)
                                          * (fVar76 * fVar122 + fVar134 * fVar90)) & uVar131) *
                             fVar63 + (float)(~uVar131 & (uint)fVar124 |
                                             (uint)(((1.0 - auVar42._4_4_ * fVar84) * fVar84 +
                                                    fVar84) * (fVar135 * fVar110 + auVar58._4_4_)) &
                                             uVar131) * fVar83 + fVar104 * fVar46) * auVar107._4_4_
                             + (fVar103 * fVar64 +
                               (float)(~uVar131 & (uint)fVar120 |
                                      (uint)(((1.0 - auVar108._4_4_ * fVar144) * fVar144 + fVar144)
                                            * (fVar126 * fVar76 + fVar40 * fVar120)) & uVar131) *
                               fVar63 + (float)(~uVar131 & (uint)fVar136 |
                                               (uint)(((1.0 - auVar150._4_4_ * fVar88) * fVar88 +
                                                      fVar88) * (fVar110 * fVar136 + auVar59._4_4_))
                                               & uVar131) * fVar83 + fVar94 * fVar46) *
                               fVar44 * 3.0 * fVar121 * fVar121 +
                            (fVar139 * fVar64 + fVar3 * fVar63 + fVar137 * fVar83 + fVar127 * fVar46
                            ) * fVar121 * fVar121 * fVar121) * dscale) & uVar19;
        puVar31[2] = ~uVar12 & puVar31[2] |
                     (uint)(((fVar45 * fVar81 +
                             fVar149 * fVar77 + fVar145 * fVar87 + fVar147 * fVar49) *
                             fVar47 * fVar47 * fVar47 +
                             (fVar105 * fVar81 +
                             (float)(~uVar132 & (uint)fVar122 |
                                    (uint)(((1.0 - (fVar50 + fVar78) * fVar116) * fVar116 + fVar116)
                                          * (fVar78 * fVar122 + fVar134 * fVar50)) & uVar132) *
                             fVar77 + (float)(~uVar132 & (uint)fVar124 |
                                             (uint)(((1.0 - auVar42._8_4_ * fVar92) * fVar92 +
                                                    fVar92) * (fVar135 * fVar111 + auVar58._8_4_)) &
                                             uVar132) * fVar87 + fVar104 * fVar49) * auVar107._8_4_
                             + (fVar103 * fVar81 +
                               (float)(~uVar132 & (uint)fVar120 |
                                      (uint)(((1.0 - auVar108._8_4_ * fVar148) * fVar148 + fVar148)
                                            * (fVar126 * fVar78 + fVar68 * fVar120)) & uVar132) *
                               fVar77 + (float)(~uVar132 & (uint)fVar136 |
                                               (uint)(((1.0 - auVar150._8_4_ * fVar93) * fVar93 +
                                                      fVar93) * (fVar111 * fVar136 + auVar59._8_4_))
                                               & uVar132) * fVar87 + fVar94 * fVar49) *
                               fVar47 * 3.0 * fVar123 * fVar123 +
                            (fVar139 * fVar81 + fVar3 * fVar77 + fVar137 * fVar87 + fVar127 * fVar49
                            ) * fVar123 * fVar123 * fVar123) * dscale) & uVar12;
        puVar31[3] = ~uVar13 & puVar31[3] |
                     (uint)(((fVar45 * fVar89 +
                             fVar149 * fVar85 + fVar145 * fVar91 + fVar147 * fVar53) *
                             fVar52 * fVar52 * fVar52 +
                             (fVar105 * fVar89 +
                             (float)(~uVar133 & (uint)fVar122 |
                                    (uint)(((1.0 - (fVar54 + fVar82) * fVar118) * fVar118 + fVar118)
                                          * (fVar82 * fVar122 + fVar134 * fVar54)) & uVar133) *
                             fVar85 + (float)(~uVar133 & (uint)fVar124 |
                                             (uint)(((1.0 - auVar42._12_4_ * fVar65) * fVar65 +
                                                    fVar65) * (fVar135 * fVar112 + auVar58._12_4_))
                                             & uVar133) * fVar91 + fVar104 * fVar53) *
                             auVar107._12_4_ +
                             (fVar103 * fVar89 +
                             (float)(~uVar133 & (uint)fVar120 |
                                    (uint)(((1.0 - auVar108._12_4_ * fVar117) * fVar117 + fVar117) *
                                          (fVar126 * fVar82 + fVar74 * fVar120)) & uVar133) * fVar85
                             + (float)(~uVar133 & (uint)fVar136 |
                                      (uint)(((1.0 - auVar150._12_4_ * fVar66) * fVar66 + fVar66) *
                                            (fVar112 * fVar136 + auVar59._12_4_)) & uVar133) *
                               fVar91 + fVar94 * fVar53) * fVar52 * 3.0 * fVar125 * fVar125 +
                            (fVar139 * fVar89 + fVar3 * fVar85 + fVar137 * fVar91 + fVar127 * fVar53
                            ) * fVar125 * fVar125 * fVar125) * dscale) & uVar13;
        puVar31 = puVar31 + lVar27;
      }
    }
    if (puVar30 != (uint *)0x0) {
      fVar39 = (v->field_0).v[0];
      fVar46 = (v->field_0).v[1];
      fVar49 = (v->field_0).v[2];
      fVar53 = (v->field_0).v[3];
      fVar77 = 1.0 - fVar39;
      fVar81 = 1.0 - fVar46;
      fVar85 = 1.0 - fVar49;
      fVar89 = 1.0 - fVar53;
      fVar119 = *(float *)depth;
      fVar121 = *(float *)(depth + 4);
      fVar123 = *(float *)(depth + 8);
      fVar125 = *(float *)(depth + 0xc);
      fVar38 = 1.0 - fVar119;
      fVar44 = 1.0 - fVar121;
      fVar47 = 1.0 - fVar123;
      fVar52 = 1.0 - fVar125;
      fVar79 = fVar119 * fVar119 * fVar119;
      fVar83 = fVar121 * fVar121 * fVar121;
      fVar87 = fVar123 * fVar123 * fVar123;
      fVar91 = fVar125 * fVar125 * fVar125;
      fVar120 = fVar119 * fVar119 * 3.0 * fVar38;
      fVar122 = fVar121 * fVar121 * 3.0 * fVar44;
      fVar124 = fVar123 * fVar123 * 3.0 * fVar47;
      fVar126 = fVar125 * fVar125 * 3.0 * fVar52;
      fVar55 = fVar38 * fVar38 * fVar38;
      fVar62 = fVar44 * fVar44 * fVar44;
      fVar63 = fVar47 * fVar47 * fVar47;
      fVar64 = fVar52 * fVar52 * fVar52;
      fVar38 = fVar119 * 3.0 * fVar38 * fVar38;
      fVar121 = fVar121 * 3.0 * fVar44 * fVar44;
      fVar123 = fVar123 * 3.0 * fVar47 * fVar47;
      fVar125 = fVar125 * 3.0 * fVar52 * fVar52;
      lVar36 = uVar37 + 0x130;
      fVar119 = dscale * dscale;
      sVar28 = 0;
      while( true ) {
        fVar44 = (v->field_0).v[0];
        fVar47 = (v->field_0).v[1];
        fVar52 = (v->field_0).v[2];
        fVar134 = (v->field_0).v[3];
        if (RVar25.ptr == sVar28) break;
        fVar68 = *(float *)depth;
        fVar74 = *(float *)(depth + 4);
        fVar75 = *(float *)(depth + 8);
        fVar76 = *(float *)(depth + 0xc);
        uVar130 = -(uint)((fVar68 != 0.0 && fVar68 != 1.0) && (fVar44 != 0.0 && fVar44 != 1.0));
        uVar131 = -(uint)((fVar74 != 0.0 && fVar74 != 1.0) && (fVar47 != 0.0 && fVar47 != 1.0));
        uVar132 = -(uint)((fVar75 != 0.0 && fVar75 != 1.0) && (fVar52 != 0.0 && fVar52 != 1.0));
        uVar133 = -(uint)((fVar76 != 0.0 && fVar76 != 1.0) && (fVar134 != 0.0 && fVar134 != 1.0));
        fVar135 = *(float *)(uVar37 + 0x50 + sVar28 * 4);
        fVar136 = *(float *)(uVar37 + 0x60 + sVar28 * 4);
        fVar137 = *(float *)(uVar37 + 0xa0 + sVar28 * 4);
        fVar127 = *(float *)(uVar37 + 0x100 + sVar28 * 4);
        fVar3 = *(float *)(uVar37 + 0x110 + sVar28 * 4);
        fVar139 = 1.0 - fVar44;
        fVar145 = 1.0 - fVar47;
        fVar147 = 1.0 - fVar52;
        fVar149 = 1.0 - fVar134;
        auVar11._4_4_ = fVar47 + fVar74;
        auVar11._0_4_ = fVar44 + fVar68;
        auVar11._8_4_ = fVar52 + fVar75;
        auVar11._12_4_ = fVar134 + fVar76;
        auVar96 = rcpps(in_XMM7,auVar11);
        fVar65 = auVar96._0_4_;
        fVar66 = auVar96._4_4_;
        fVar106 = auVar96._8_4_;
        fVar110 = auVar96._12_4_;
        fVar84 = 1.0 - fVar68;
        fVar88 = 1.0 - fVar74;
        fVar92 = 1.0 - fVar75;
        fVar93 = 1.0 - fVar76;
        auVar101._0_4_ = fVar3 * fVar139;
        auVar101._4_4_ = fVar3 * fVar145;
        auVar101._8_4_ = fVar3 * fVar147;
        auVar101._12_4_ = fVar3 * fVar149;
        auVar114._0_4_ = fVar139 + fVar68;
        auVar114._4_4_ = fVar145 + fVar74;
        auVar114._8_4_ = fVar147 + fVar75;
        auVar114._12_4_ = fVar149 + fVar76;
        auVar96 = rcpps(auVar101,auVar114);
        fVar94 = auVar96._0_4_;
        fVar103 = auVar96._4_4_;
        fVar104 = auVar96._8_4_;
        fVar105 = auVar96._12_4_;
        fVar3 = *(float *)(lVar36 + sVar28 * 4);
        auVar71._0_4_ = fVar139 * fVar137;
        auVar71._4_4_ = fVar145 * fVar137;
        auVar71._8_4_ = fVar147 * fVar137;
        auVar71._12_4_ = fVar149 * fVar137;
        in_XMM7._0_4_ = fVar3 * fVar84 + auVar71._0_4_;
        in_XMM7._4_4_ = fVar3 * fVar88 + auVar71._4_4_;
        in_XMM7._8_4_ = fVar3 * fVar92 + auVar71._8_4_;
        in_XMM7._12_4_ = fVar3 * fVar93 + auVar71._12_4_;
        auVar142._0_4_ = fVar139 + fVar84;
        auVar142._4_4_ = fVar145 + fVar88;
        auVar142._8_4_ = fVar147 + fVar92;
        auVar142._12_4_ = fVar149 + fVar93;
        auVar96 = rcpps(auVar71,auVar142);
        fVar78 = auVar96._0_4_;
        fVar86 = auVar96._4_4_;
        fVar50 = auVar96._8_4_;
        fVar67 = auVar96._12_4_;
        fVar3 = *(float *)(uVar37 + 0x90 + sVar28 * 4);
        fVar139 = *(float *)(uVar37 + 0x120 + sVar28 * 4);
        auVar72._0_4_ = fVar139 * fVar44;
        auVar72._4_4_ = fVar139 * fVar47;
        auVar72._8_4_ = fVar139 * fVar52;
        auVar72._12_4_ = fVar139 * fVar134;
        auVar7._4_4_ = fVar47 + fVar88;
        auVar7._0_4_ = fVar44 + fVar84;
        auVar7._8_4_ = fVar52 + fVar92;
        auVar7._12_4_ = fVar134 + fVar93;
        auVar96 = rcpps(auVar72,auVar7);
        fVar82 = auVar96._0_4_;
        fVar90 = auVar96._4_4_;
        fVar54 = auVar96._8_4_;
        fVar80 = auVar96._12_4_;
        auVar60._0_4_ = ~uVar130 & (uint)fVar136;
        auVar60._4_4_ = ~uVar131 & (uint)fVar136;
        auVar60._8_4_ = ~uVar132 & (uint)fVar136;
        auVar60._12_4_ = ~uVar133 & (uint)fVar136;
        in_XMM6._0_4_ =
             (float)((uint)(((1.0 - auVar114._0_4_ * fVar94) * fVar94 + fVar94) *
                           (fVar68 * fVar136 + auVar101._0_4_)) & uVar130);
        in_XMM6._4_4_ =
             (float)((uint)(((1.0 - auVar114._4_4_ * fVar103) * fVar103 + fVar103) *
                           (fVar74 * fVar136 + auVar101._4_4_)) & uVar131);
        in_XMM6._8_4_ =
             (float)((uint)(((1.0 - auVar114._8_4_ * fVar104) * fVar104 + fVar104) *
                           (fVar75 * fVar136 + auVar101._8_4_)) & uVar132);
        in_XMM6._12_4_ =
             (float)((uint)(((1.0 - auVar114._12_4_ * fVar105) * fVar105 + fVar105) *
                           (fVar76 * fVar136 + auVar101._12_4_)) & uVar133);
        auVar60 = auVar60 | in_XMM6;
        fVar136 = *(float *)(uVar37 + 0x80 + sVar28 * 4);
        fVar139 = *(float *)(uVar37 + 0xc0 + sVar28 * 4);
        fVar94 = *(float *)(uVar37 + 0x40 + sVar28 * 4);
        fVar103 = *(float *)(uVar37 + sVar28 * 4);
        fVar104 = *(float *)(uVar37 + 0xd0 + sVar28 * 4);
        fVar105 = *(float *)(uVar37 + 0x10 + sVar28 * 4);
        fVar145 = *(float *)(uVar37 + 0xe0 + sVar28 * 4);
        fVar147 = *(float *)(uVar37 + 0x20 + sVar28 * 4);
        fVar149 = *(float *)(uVar37 + 0xb0 + sVar28 * 4);
        fVar45 = *(float *)(uVar37 + 0xf0 + sVar28 * 4);
        fVar48 = *(float *)(uVar37 + 0x70 + sVar28 * 4);
        fVar40 = *(float *)(uVar37 + 0x30 + sVar28 * 4);
        uVar19 = *(uint *)(This.ptr + 4);
        uVar12 = *(uint *)(This.ptr + 8);
        uVar13 = *(uint *)(This.ptr + 0xc);
        *puVar30 = ~*(uint *)This.ptr & *puVar30 |
                   (uint)(((fVar40 * fVar55 + fVar48 * fVar38 + fVar149 * fVar120 + fVar45 * fVar79)
                           * fVar39 * 6.0 +
                           (fVar147 * fVar55 +
                           auVar60._0_4_ * fVar38 +
                           (float)(~uVar130 & (uint)fVar137 |
                                  (uint)(((1.0 - auVar142._0_4_ * fVar78) * fVar78 + fVar78) *
                                        in_XMM7._0_4_) & uVar130) * fVar120 + fVar145 * fVar79) *
                           (fVar77 - (fVar39 + fVar39)) * 6.0 +
                           (fVar105 * fVar55 +
                           (float)(~uVar130 & (uint)fVar135 |
                                  (uint)(((1.0 - (fVar44 + fVar68) * fVar65) * fVar65 + fVar65) *
                                        (fVar127 * fVar68 + fVar44 * fVar135)) & uVar130) * fVar38 +
                           (float)(~uVar130 & (uint)fVar3 |
                                  (uint)(((1.0 - (fVar44 + fVar84) * fVar82) * fVar82 + fVar82) *
                                        (fVar84 * fVar3 + auVar72._0_4_)) & uVar130) * fVar120 +
                           fVar104 * fVar79) * (fVar39 - (fVar77 + fVar77)) * 6.0 +
                          (fVar103 * fVar55 + fVar94 * fVar38 + fVar136 * fVar120 + fVar139 * fVar79
                          ) * fVar77 * 6.0) * fVar119) & *(uint *)This.ptr;
        puVar30[1] = ~uVar19 & puVar30[1] |
                     (uint)(((fVar40 * fVar62 +
                             fVar48 * fVar121 + fVar149 * fVar122 + fVar45 * fVar83) * fVar46 * 6.0
                             + (fVar147 * fVar62 +
                               auVar60._4_4_ * fVar121 +
                               (float)(~uVar131 & (uint)fVar137 |
                                      (uint)(((1.0 - auVar142._4_4_ * fVar86) * fVar86 + fVar86) *
                                            in_XMM7._4_4_) & uVar131) * fVar122 + fVar145 * fVar83)
                               * (fVar81 - (fVar46 + fVar46)) * 6.0 +
                             (fVar105 * fVar62 +
                             (float)(~uVar131 & (uint)fVar135 |
                                    (uint)(((1.0 - (fVar47 + fVar74) * fVar66) * fVar66 + fVar66) *
                                          (fVar127 * fVar74 + fVar47 * fVar135)) & uVar131) *
                             fVar121 + (float)(~uVar131 & (uint)fVar3 |
                                              (uint)(((1.0 - (fVar47 + fVar88) * fVar90) * fVar90 +
                                                     fVar90) * (fVar88 * fVar3 + auVar72._4_4_)) &
                                              uVar131) * fVar122 + fVar104 * fVar83) *
                             (fVar46 - (fVar81 + fVar81)) * 6.0 +
                            (fVar103 * fVar62 +
                            fVar94 * fVar121 + fVar136 * fVar122 + fVar139 * fVar83) * fVar81 * 6.0)
                           * fVar119) & uVar19;
        puVar30[2] = ~uVar12 & puVar30[2] |
                     (uint)(((fVar40 * fVar63 +
                             fVar48 * fVar123 + fVar149 * fVar124 + fVar45 * fVar87) * fVar49 * 6.0
                             + (fVar147 * fVar63 +
                               auVar60._8_4_ * fVar123 +
                               (float)(~uVar132 & (uint)fVar137 |
                                      (uint)(((1.0 - auVar142._8_4_ * fVar50) * fVar50 + fVar50) *
                                            in_XMM7._8_4_) & uVar132) * fVar124 + fVar145 * fVar87)
                               * (fVar85 - (fVar49 + fVar49)) * 6.0 +
                             (fVar105 * fVar63 +
                             (float)(~uVar132 & (uint)fVar135 |
                                    (uint)(((1.0 - (fVar52 + fVar75) * fVar106) * fVar106 + fVar106)
                                          * (fVar127 * fVar75 + fVar52 * fVar135)) & uVar132) *
                             fVar123 + (float)(~uVar132 & (uint)fVar3 |
                                              (uint)(((1.0 - (fVar52 + fVar92) * fVar54) * fVar54 +
                                                     fVar54) * (fVar92 * fVar3 + auVar72._8_4_)) &
                                              uVar132) * fVar124 + fVar104 * fVar87) *
                             (fVar49 - (fVar85 + fVar85)) * 6.0 +
                            (fVar103 * fVar63 +
                            fVar94 * fVar123 + fVar136 * fVar124 + fVar139 * fVar87) * fVar85 * 6.0)
                           * fVar119) & uVar12;
        puVar30[3] = ~uVar13 & puVar30[3] |
                     (uint)(((fVar40 * fVar64 +
                             fVar48 * fVar125 + fVar149 * fVar126 + fVar45 * fVar91) * fVar53 * 6.0
                             + (fVar147 * fVar64 +
                               auVar60._12_4_ * fVar125 +
                               (float)(~uVar133 & (uint)fVar137 |
                                      (uint)(((1.0 - auVar142._12_4_ * fVar67) * fVar67 + fVar67) *
                                            in_XMM7._12_4_) & uVar133) * fVar126 + fVar145 * fVar91)
                               * (fVar89 - (fVar53 + fVar53)) * 6.0 +
                             (fVar105 * fVar64 +
                             (float)(~uVar133 & (uint)fVar135 |
                                    (uint)(((1.0 - (fVar134 + fVar76) * fVar110) * fVar110 + fVar110
                                           ) * (fVar127 * fVar76 + fVar134 * fVar135)) & uVar133) *
                             fVar125 + (float)(~uVar133 & (uint)fVar3 |
                                              (uint)(((1.0 - (fVar134 + fVar93) * fVar80) * fVar80 +
                                                     fVar80) * (fVar93 * fVar3 + auVar72._12_4_)) &
                                              uVar133) * fVar126 + fVar104 * fVar91) *
                             (fVar53 - (fVar89 + fVar89)) * 6.0 +
                            (fVar103 * fVar64 +
                            fVar94 * fVar125 + fVar136 * fVar126 + fVar139 * fVar91) * fVar89 * 6.0)
                           * fVar119) & uVar13;
        sVar28 = sVar28 + 1;
        puVar30 = puVar30 + lVar27;
      }
      fVar39 = 1.0 - fVar44;
      fVar46 = 1.0 - fVar47;
      fVar49 = 1.0 - fVar52;
      fVar53 = 1.0 - fVar134;
      local_e00._0_4_ = *(undefined4 *)depth;
      local_e00._4_4_ = *(float *)(depth + 4);
      fStack_df8 = *(float *)(depth + 8);
      fStack_df4 = *(float *)(depth + 0xc);
      fVar121 = 1.0 - (float)local_e00._0_4_;
      fVar125 = 1.0 - (float)local_e00._4_4_;
      fVar55 = 1.0 - fStack_df8;
      fVar63 = 1.0 - fStack_df4;
      fVar123 = fVar121 * 6.0;
      fVar38 = fVar125 * 6.0;
      fVar62 = fVar55 * 6.0;
      fVar64 = fVar63 * 6.0;
      local_e10._0_4_ = ((float)local_e00._0_4_ - (fVar121 + fVar121)) * 6.0;
      local_e10._4_4_ = ((float)local_e00._4_4_ - (fVar125 + fVar125)) * 6.0;
      fStack_e08 = (fStack_df8 - (fVar55 + fVar55)) * 6.0;
      fStack_e04 = (fStack_df4 - (fVar63 + fVar63)) * 6.0;
      fVar121 = (fVar121 - ((float)local_e00._0_4_ + (float)local_e00._0_4_)) * 6.0;
      fVar125 = (fVar125 - ((float)local_e00._4_4_ + (float)local_e00._4_4_)) * 6.0;
      fVar55 = (fVar55 - (fStack_df8 + fStack_df8)) * 6.0;
      fVar63 = (fVar63 - (fStack_df4 + fStack_df4)) * 6.0;
      local_e00._0_4_ = (float)local_e00._0_4_ * 6.0;
      local_e00._4_4_ = (float)local_e00._4_4_ * 6.0;
      fStack_df8 = fStack_df8 * 6.0;
      fStack_df4 = fStack_df4 * 6.0;
      sVar28 = 0;
      while( true ) {
        fVar77 = (v->field_0).v[0];
        fVar81 = (v->field_0).v[1];
        fVar85 = (v->field_0).v[2];
        fVar89 = (v->field_0).v[3];
        if (RVar25.ptr == sVar28) break;
        fVar147 = *(float *)depth;
        fVar149 = *(float *)(depth + 4);
        fVar45 = *(float *)(depth + 8);
        fVar48 = *(float *)(depth + 0xc);
        uVar130 = -(uint)((fVar147 != 0.0 && fVar147 != 1.0) && (fVar77 != 0.0 && fVar77 != 1.0));
        uVar131 = -(uint)((fVar149 != 0.0 && fVar149 != 1.0) && (fVar81 != 0.0 && fVar81 != 1.0));
        uVar132 = -(uint)((fVar45 != 0.0 && fVar45 != 1.0) && (fVar85 != 0.0 && fVar85 != 1.0));
        uVar133 = -(uint)((fVar48 != 0.0 && fVar48 != 1.0) && (fVar89 != 0.0 && fVar89 != 1.0));
        fVar79 = *(float *)(uVar37 + 0x50 + sVar28 * 4);
        fVar83 = *(float *)(uVar37 + 0x60 + sVar28 * 4);
        fVar87 = *(float *)(uVar37 + 0xa0 + sVar28 * 4);
        fVar91 = *(float *)(uVar37 + 0x100 + sVar28 * 4);
        fVar120 = *(float *)(uVar37 + 0x110 + sVar28 * 4);
        fVar40 = 1.0 - fVar77;
        fVar68 = 1.0 - fVar81;
        fVar74 = 1.0 - fVar85;
        fVar75 = 1.0 - fVar89;
        auVar155._0_4_ = fVar77 + fVar147;
        auVar155._4_4_ = fVar81 + fVar149;
        auVar155._8_4_ = fVar85 + fVar45;
        auVar155._12_4_ = fVar89 + fVar48;
        auVar96 = rcpps(in_XMM7,auVar155);
        fVar76 = auVar96._0_4_;
        fVar90 = auVar96._4_4_;
        fVar80 = auVar96._8_4_;
        fVar93 = auVar96._12_4_;
        fVar110 = 1.0 - fVar147;
        fVar111 = 1.0 - fVar149;
        fVar112 = 1.0 - fVar45;
        fVar156 = 1.0 - fVar48;
        auVar109._0_4_ = fVar40 + fVar147;
        auVar109._4_4_ = fVar68 + fVar149;
        auVar109._8_4_ = fVar74 + fVar45;
        auVar109._12_4_ = fVar75 + fVar48;
        auVar96 = rcpps(auVar96,auVar109);
        fVar78 = auVar96._0_4_;
        fVar50 = auVar96._4_4_;
        fVar84 = auVar96._8_4_;
        fVar65 = auVar96._12_4_;
        fVar122 = *(float *)(lVar36 + sVar28 * 4);
        auVar43._0_4_ = fVar40 + fVar110;
        auVar43._4_4_ = fVar68 + fVar111;
        auVar43._8_4_ = fVar74 + fVar112;
        auVar43._12_4_ = fVar75 + fVar156;
        auVar96 = rcpps(auVar96,auVar43);
        fVar82 = auVar96._0_4_;
        fVar54 = auVar96._4_4_;
        fVar88 = auVar96._8_4_;
        fVar66 = auVar96._12_4_;
        fVar124 = *(float *)(uVar37 + 0x90 + sVar28 * 4);
        fVar126 = *(float *)(uVar37 + 0x120 + sVar28 * 4);
        auVar115._0_4_ = fVar126 * fVar77;
        auVar115._4_4_ = fVar126 * fVar81;
        auVar115._8_4_ = fVar126 * fVar85;
        auVar115._12_4_ = fVar126 * fVar89;
        auVar73._0_4_ = fVar77 + fVar110;
        auVar73._4_4_ = fVar81 + fVar111;
        auVar73._8_4_ = fVar85 + fVar112;
        auVar73._12_4_ = fVar89 + fVar156;
        auVar96 = rcpps(auVar115,auVar73);
        fVar86 = auVar96._0_4_;
        fVar67 = auVar96._4_4_;
        fVar92 = auVar96._8_4_;
        fVar106 = auVar96._12_4_;
        fVar126 = *(float *)(uVar37 + 0x80 + sVar28 * 4);
        fVar135 = *(float *)(uVar37 + 0xc0 + sVar28 * 4);
        fVar136 = *(float *)(uVar37 + 0x40 + sVar28 * 4);
        fVar137 = *(float *)(uVar37 + sVar28 * 4);
        fVar127 = *(float *)(uVar37 + 0xd0 + sVar28 * 4);
        fVar3 = *(float *)(uVar37 + 0x10 + sVar28 * 4);
        fVar139 = *(float *)(uVar37 + 0xe0 + sVar28 * 4);
        fVar94 = *(float *)(uVar37 + 0x20 + sVar28 * 4);
        fVar103 = *(float *)(uVar37 + 0xb0 + sVar28 * 4);
        fVar104 = *(float *)(uVar37 + 0xf0 + sVar28 * 4);
        fVar105 = *(float *)(uVar37 + 0x70 + sVar28 * 4);
        fVar145 = *(float *)(uVar37 + 0x30 + sVar28 * 4);
        uVar19 = *(uint *)(This.ptr + 4);
        uVar12 = *(uint *)(This.ptr + 8);
        uVar13 = *(uint *)(This.ptr + 0xc);
        *puVar29 = ~*(uint *)This.ptr & *puVar29 |
                   (uint)(((fVar145 * fVar123 +
                           fVar105 * (float)local_e10._0_4_ +
                           fVar103 * fVar121 + fVar104 * (float)local_e00._0_4_) *
                           fVar44 * fVar44 * fVar44 +
                           (fVar94 * fVar123 +
                           (float)(~uVar130 & (uint)fVar83 |
                                  (uint)(((1.0 - auVar109._0_4_ * fVar78) * fVar78 + fVar78) *
                                        (fVar147 * fVar83 + fVar120 * fVar40)) & uVar130) *
                           (float)local_e10._0_4_ +
                           (float)(~uVar130 & (uint)fVar87 |
                                  (uint)(((1.0 - auVar43._0_4_ * fVar82) * fVar82 + fVar82) *
                                        (fVar122 * fVar110 + fVar40 * fVar87)) & uVar130) * fVar121
                           + fVar139 * (float)local_e00._0_4_) * fVar44 * fVar44 * 3.0 * fVar39 +
                           (fVar3 * fVar123 +
                           (float)(~uVar130 & (uint)fVar79 |
                                  (uint)(((1.0 - auVar155._0_4_ * fVar76) * fVar76 + fVar76) *
                                        (fVar91 * fVar147 + fVar77 * fVar79)) & uVar130) *
                           (float)local_e10._0_4_ +
                           (float)(~uVar130 & (uint)fVar124 |
                                  (uint)(((1.0 - auVar73._0_4_ * fVar86) * fVar86 + fVar86) *
                                        (fVar110 * fVar124 + auVar115._0_4_)) & uVar130) * fVar121 +
                           fVar127 * (float)local_e00._0_4_) * fVar44 * 3.0 * fVar39 * fVar39 +
                          (fVar137 * fVar123 +
                          fVar136 * (float)local_e10._0_4_ +
                          fVar126 * fVar121 + fVar135 * (float)local_e00._0_4_) *
                          fVar39 * fVar39 * fVar39) * fVar119) & *(uint *)This.ptr;
        puVar29[1] = ~uVar19 & puVar29[1] |
                     (uint)(((fVar145 * fVar38 +
                             fVar105 * (float)local_e10._4_4_ +
                             fVar103 * fVar125 + fVar104 * (float)local_e00._4_4_) *
                             fVar47 * fVar47 * fVar47 +
                             (fVar94 * fVar38 +
                             (float)(~uVar131 & (uint)fVar83 |
                                    (uint)(((1.0 - auVar109._4_4_ * fVar50) * fVar50 + fVar50) *
                                          (fVar149 * fVar83 + fVar120 * fVar68)) & uVar131) *
                             (float)local_e10._4_4_ +
                             (float)(~uVar131 & (uint)fVar87 |
                                    (uint)(((1.0 - auVar43._4_4_ * fVar54) * fVar54 + fVar54) *
                                          (fVar122 * fVar111 + fVar68 * fVar87)) & uVar131) *
                             fVar125 + fVar139 * (float)local_e00._4_4_) *
                             fVar47 * fVar47 * 3.0 * fVar46 +
                             (fVar3 * fVar38 +
                             (float)(~uVar131 & (uint)fVar79 |
                                    (uint)(((1.0 - auVar155._4_4_ * fVar90) * fVar90 + fVar90) *
                                          (fVar91 * fVar149 + fVar81 * fVar79)) & uVar131) *
                             (float)local_e10._4_4_ +
                             (float)(~uVar131 & (uint)fVar124 |
                                    (uint)(((1.0 - auVar73._4_4_ * fVar67) * fVar67 + fVar67) *
                                          (fVar111 * fVar124 + auVar115._4_4_)) & uVar131) * fVar125
                             + fVar127 * (float)local_e00._4_4_) * fVar47 * 3.0 * fVar46 * fVar46 +
                            (fVar137 * fVar38 +
                            fVar136 * (float)local_e10._4_4_ +
                            fVar126 * fVar125 + fVar135 * (float)local_e00._4_4_) *
                            fVar46 * fVar46 * fVar46) * fVar119) & uVar19;
        puVar29[2] = ~uVar12 & puVar29[2] |
                     (uint)(((fVar145 * fVar62 +
                             fVar105 * fStack_e08 + fVar103 * fVar55 + fVar104 * fStack_df8) *
                             fVar52 * fVar52 * fVar52 +
                             (fVar94 * fVar62 +
                             (float)(~uVar132 & (uint)fVar83 |
                                    (uint)(((1.0 - auVar109._8_4_ * fVar84) * fVar84 + fVar84) *
                                          (fVar45 * fVar83 + fVar120 * fVar74)) & uVar132) *
                             fStack_e08 +
                             (float)(~uVar132 & (uint)fVar87 |
                                    (uint)(((1.0 - auVar43._8_4_ * fVar88) * fVar88 + fVar88) *
                                          (fVar122 * fVar112 + fVar74 * fVar87)) & uVar132) * fVar55
                             + fVar139 * fStack_df8) * fVar52 * fVar52 * 3.0 * fVar49 +
                             (fVar3 * fVar62 +
                             (float)(~uVar132 & (uint)fVar79 |
                                    (uint)(((1.0 - auVar155._8_4_ * fVar80) * fVar80 + fVar80) *
                                          (fVar91 * fVar45 + fVar85 * fVar79)) & uVar132) *
                             fStack_e08 +
                             (float)(~uVar132 & (uint)fVar124 |
                                    (uint)(((1.0 - auVar73._8_4_ * fVar92) * fVar92 + fVar92) *
                                          (fVar112 * fVar124 + auVar115._8_4_)) & uVar132) * fVar55
                             + fVar127 * fStack_df8) * fVar52 * 3.0 * fVar49 * fVar49 +
                            (fVar137 * fVar62 +
                            fVar136 * fStack_e08 + fVar126 * fVar55 + fVar135 * fStack_df8) *
                            fVar49 * fVar49 * fVar49) * fVar119) & uVar12;
        puVar29[3] = ~uVar13 & puVar29[3] |
                     (uint)(((fVar145 * fVar64 +
                             fVar105 * fStack_e04 + fVar103 * fVar63 + fVar104 * fStack_df4) *
                             fVar134 * fVar134 * fVar134 +
                             (fVar94 * fVar64 +
                             (float)(~uVar133 & (uint)fVar83 |
                                    (uint)(((1.0 - auVar109._12_4_ * fVar65) * fVar65 + fVar65) *
                                          (fVar48 * fVar83 + fVar120 * fVar75)) & uVar133) *
                             fStack_e04 +
                             (float)(~uVar133 & (uint)fVar87 |
                                    (uint)(((1.0 - auVar43._12_4_ * fVar66) * fVar66 + fVar66) *
                                          (fVar122 * fVar156 + fVar75 * fVar87)) & uVar133) * fVar63
                             + fVar139 * fStack_df4) * fVar134 * fVar134 * 3.0 * fVar53 +
                             (fVar3 * fVar64 +
                             (float)(~uVar133 & (uint)fVar79 |
                                    (uint)(((1.0 - auVar155._12_4_ * fVar93) * fVar93 + fVar93) *
                                          (fVar91 * fVar48 + fVar89 * fVar79)) & uVar133) *
                             fStack_e04 +
                             (float)(~uVar133 & (uint)fVar124 |
                                    (uint)(((1.0 - auVar73._12_4_ * fVar106) * fVar106 + fVar106) *
                                          (fVar156 * fVar124 + auVar115._12_4_)) & uVar133) * fVar63
                             + fVar127 * fStack_df4) * fVar134 * 3.0 * fVar53 * fVar53 +
                            (fVar137 * fVar64 +
                            fVar136 * fStack_e04 + fVar126 * fVar63 + fVar135 * fStack_df4) *
                            fVar53 * fVar53 * fVar53) * fVar119) & uVar13;
        sVar28 = sVar28 + 1;
        puVar29 = puVar29 + lVar27;
        in_XMM6 = _local_e00;
        in_XMM7 = _local_e10;
      }
      fVar44 = 1.0 - fVar77;
      fVar47 = 1.0 - fVar81;
      fVar52 = 1.0 - fVar85;
      fVar55 = 1.0 - fVar89;
      fVar62 = fVar77 * fVar44 + fVar77 * fVar44;
      fVar63 = fVar81 * fVar47 + fVar81 * fVar47;
      fVar64 = fVar85 * fVar52 + fVar85 * fVar52;
      fVar79 = fVar89 * fVar55 + fVar89 * fVar55;
      fVar39 = *(float *)depth;
      fVar46 = *(float *)(depth + 4);
      fVar49 = *(float *)(depth + 8);
      fVar53 = *(float *)(depth + 0xc);
      fVar121 = 1.0 - fVar39;
      fVar123 = 1.0 - fVar46;
      fVar125 = 1.0 - fVar49;
      fVar38 = 1.0 - fVar53;
      fVar83 = fVar39 * fVar121 + fVar39 * fVar121;
      fVar87 = fVar46 * fVar123 + fVar46 * fVar123;
      fVar91 = fVar49 * fVar125 + fVar49 * fVar125;
      fVar120 = fVar53 * fVar38 + fVar53 * fVar38;
      local_e10._0_4_ = fVar121 * fVar121 * -3.0;
      local_e10._4_4_ = fVar123 * fVar123 * -3.0;
      fStack_e08 = fVar125 * fVar125 * -3.0;
      fStack_e04 = fVar38 * fVar38 * -3.0;
      fVar121 = (fVar121 * fVar121 - fVar83) * 3.0;
      fVar123 = (fVar123 * fVar123 - fVar87) * 3.0;
      fVar125 = (fVar125 * fVar125 - fVar91) * 3.0;
      fVar38 = (fVar38 * fVar38 - fVar120) * 3.0;
      fVar83 = (fVar83 - fVar39 * fVar39) * 3.0;
      fVar87 = (fVar87 - fVar46 * fVar46) * 3.0;
      fVar91 = (fVar91 - fVar49 * fVar49) * 3.0;
      fVar120 = (fVar120 - fVar53 * fVar53) * 3.0;
      fVar39 = fVar39 * fVar39 * 3.0;
      fVar46 = fVar46 * fVar46 * 3.0;
      fVar49 = fVar49 * fVar49 * 3.0;
      fVar53 = fVar53 * fVar53 * 3.0;
      for (sVar28 = 0; RVar25.ptr != sVar28; sVar28 = sVar28 + 1) {
        fVar40 = (v->field_0).v[0];
        fVar68 = (v->field_0).v[1];
        fVar74 = (v->field_0).v[2];
        fVar75 = (v->field_0).v[3];
        fVar76 = *(float *)depth;
        fVar78 = *(float *)(depth + 4);
        fVar82 = *(float *)(depth + 8);
        fVar86 = *(float *)(depth + 0xc);
        uVar130 = -(uint)((fVar76 != 0.0 && fVar76 != 1.0) && (fVar40 != 0.0 && fVar40 != 1.0));
        uVar131 = -(uint)((fVar78 != 0.0 && fVar78 != 1.0) && (fVar68 != 0.0 && fVar68 != 1.0));
        uVar132 = -(uint)((fVar82 != 0.0 && fVar82 != 1.0) && (fVar74 != 0.0 && fVar74 != 1.0));
        uVar133 = -(uint)((fVar86 != 0.0 && fVar86 != 1.0) && (fVar75 != 0.0 && fVar75 != 1.0));
        fVar122 = *(float *)(uVar37 + 0x50 + sVar28 * 4);
        fVar124 = *(float *)(uVar37 + 0x60 + sVar28 * 4);
        fVar126 = *(float *)(uVar37 + 0xa0 + sVar28 * 4);
        fVar134 = *(float *)(uVar37 + 0x100 + sVar28 * 4);
        fVar135 = *(float *)(uVar37 + 0x110 + sVar28 * 4);
        fVar80 = 1.0 - fVar40;
        fVar84 = 1.0 - fVar68;
        fVar88 = 1.0 - fVar74;
        fVar92 = 1.0 - fVar75;
        auVar61._0_4_ = fVar40 + fVar76;
        auVar61._4_4_ = fVar68 + fVar78;
        auVar61._8_4_ = fVar74 + fVar82;
        auVar61._12_4_ = fVar75 + fVar86;
        auVar96 = rcpps(in_XMM6,auVar61);
        fVar93 = auVar96._0_4_;
        fVar106 = auVar96._4_4_;
        fVar112 = auVar96._8_4_;
        fVar144 = auVar96._12_4_;
        fVar90 = 1.0 - fVar76;
        fVar50 = 1.0 - fVar78;
        fVar54 = 1.0 - fVar82;
        fVar67 = 1.0 - fVar86;
        auVar102._0_4_ = fVar80 + fVar76;
        auVar102._4_4_ = fVar84 + fVar78;
        auVar102._8_4_ = fVar88 + fVar82;
        auVar102._12_4_ = fVar92 + fVar86;
        auVar96 = rcpps(auVar96,auVar102);
        fVar65 = auVar96._0_4_;
        fVar110 = auVar96._4_4_;
        fVar156 = auVar96._8_4_;
        fVar146 = auVar96._12_4_;
        fVar136 = *(float *)(lVar36 + sVar28 * 4);
        auVar128._0_4_ = fVar136 * fVar90 + fVar80 * fVar126;
        auVar128._4_4_ = fVar136 * fVar50 + fVar84 * fVar126;
        auVar128._8_4_ = fVar136 * fVar54 + fVar88 * fVar126;
        auVar128._12_4_ = fVar136 * fVar67 + fVar92 * fVar126;
        auVar8._4_4_ = fVar84 + fVar50;
        auVar8._0_4_ = fVar80 + fVar90;
        auVar8._8_4_ = fVar88 + fVar54;
        auVar8._12_4_ = fVar92 + fVar67;
        auVar96 = rcpps(auVar96,auVar8);
        fVar66 = auVar96._0_4_;
        fVar111 = auVar96._4_4_;
        fVar138 = auVar96._8_4_;
        fVar148 = auVar96._12_4_;
        fVar136 = *(float *)(uVar37 + 0x90 + sVar28 * 4);
        fVar137 = *(float *)(uVar37 + 0x120 + sVar28 * 4);
        auVar143._0_4_ = fVar40 + fVar90;
        auVar143._4_4_ = fVar68 + fVar50;
        auVar143._8_4_ = fVar74 + fVar54;
        auVar143._12_4_ = fVar75 + fVar67;
        auVar96 = rcpps(auVar128,auVar143);
        fVar116 = auVar96._0_4_;
        fVar117 = auVar96._4_4_;
        fVar118 = auVar96._8_4_;
        fVar129 = auVar96._12_4_;
        fVar127 = *(float *)(uVar37 + 0x80 + sVar28 * 4);
        fVar3 = *(float *)(uVar37 + 0xc0 + sVar28 * 4);
        fVar139 = *(float *)(uVar37 + 0x40 + sVar28 * 4);
        fVar94 = *(float *)(uVar37 + sVar28 * 4);
        fVar103 = *(float *)(uVar37 + 0xd0 + sVar28 * 4);
        fVar104 = *(float *)(uVar37 + 0x10 + sVar28 * 4);
        fVar105 = *(float *)(uVar37 + 0xe0 + sVar28 * 4);
        fVar145 = *(float *)(uVar37 + 0x20 + sVar28 * 4);
        fVar147 = *(float *)(uVar37 + 0xb0 + sVar28 * 4);
        fVar149 = *(float *)(uVar37 + 0xf0 + sVar28 * 4);
        fVar45 = *(float *)(uVar37 + 0x70 + sVar28 * 4);
        fVar48 = *(float *)(uVar37 + 0x30 + sVar28 * 4);
        uVar19 = *(uint *)(This.ptr + 4);
        uVar12 = *(uint *)(This.ptr + 8);
        uVar13 = *(uint *)(This.ptr + 0xc);
        *puVar24 = ~*(uint *)This.ptr & *puVar24 |
                   (uint)((((fVar48 * (float)local_e10._0_4_ +
                            fVar45 * fVar121 + fVar147 * fVar83 + fVar149 * fVar39) *
                            fVar77 * fVar77 * 3.0 +
                            (fVar145 * (float)local_e10._0_4_ +
                            (float)(~uVar130 & (uint)fVar124 |
                                   (uint)(((1.0 - auVar102._0_4_ * fVar65) * fVar65 + fVar65) *
                                         (fVar76 * fVar124 + fVar135 * fVar80)) & uVar130) * fVar121
                            + (float)(~uVar130 & (uint)fVar126 |
                                     (uint)(((1.0 - (fVar80 + fVar90) * fVar66) * fVar66 + fVar66) *
                                           auVar128._0_4_) & uVar130) * fVar83 + fVar105 * fVar39) *
                            (fVar62 - fVar77 * fVar77) * 3.0 +
                           (fVar104 * (float)local_e10._0_4_ +
                           (float)(~uVar130 & (uint)fVar122 |
                                  (uint)(((1.0 - auVar61._0_4_ * fVar93) * fVar93 + fVar93) *
                                        (fVar134 * fVar76 + fVar40 * fVar122)) & uVar130) * fVar121
                           + (float)(~uVar130 & (uint)fVar136 |
                                    (uint)(((1.0 - auVar143._0_4_ * fVar116) * fVar116 + fVar116) *
                                          (fVar90 * fVar136 + fVar137 * fVar40)) & uVar130) * fVar83
                             + fVar103 * fVar39) * (fVar44 * fVar44 - fVar62) * 3.0) -
                          (fVar94 * (float)local_e10._0_4_ +
                          fVar139 * fVar121 + fVar127 * fVar83 + fVar3 * fVar39) *
                          fVar44 * fVar44 * 3.0) * fVar119) & *(uint *)This.ptr;
        puVar24[1] = ~uVar19 & puVar24[1] |
                     (uint)((((fVar48 * (float)local_e10._4_4_ +
                              fVar45 * fVar123 + fVar147 * fVar87 + fVar149 * fVar46) *
                              fVar81 * fVar81 * 3.0 +
                              (fVar145 * (float)local_e10._4_4_ +
                              (float)(~uVar131 & (uint)fVar124 |
                                     (uint)(((1.0 - auVar102._4_4_ * fVar110) * fVar110 + fVar110) *
                                           (fVar78 * fVar124 + fVar135 * fVar84)) & uVar131) *
                              fVar123 + (float)(~uVar131 & (uint)fVar126 |
                                               (uint)(((1.0 - (fVar84 + fVar50) * fVar111) * fVar111
                                                      + fVar111) * auVar128._4_4_) & uVar131) *
                                        fVar87 + fVar105 * fVar46) *
                              (fVar63 - fVar81 * fVar81) * 3.0 +
                             (fVar104 * (float)local_e10._4_4_ +
                             (float)(~uVar131 & (uint)fVar122 |
                                    (uint)(((1.0 - auVar61._4_4_ * fVar106) * fVar106 + fVar106) *
                                          (fVar134 * fVar78 + fVar68 * fVar122)) & uVar131) *
                             fVar123 + (float)(~uVar131 & (uint)fVar136 |
                                              (uint)(((1.0 - auVar143._4_4_ * fVar117) * fVar117 +
                                                     fVar117) *
                                                    (fVar50 * fVar136 + fVar137 * fVar68)) & uVar131
                                              ) * fVar87 + fVar103 * fVar46) *
                             (fVar47 * fVar47 - fVar63) * 3.0) -
                            (fVar94 * (float)local_e10._4_4_ +
                            fVar139 * fVar123 + fVar127 * fVar87 + fVar3 * fVar46) *
                            fVar47 * fVar47 * 3.0) * fVar119) & uVar19;
        puVar24[2] = ~uVar12 & puVar24[2] |
                     (uint)((((fVar48 * fStack_e08 +
                              fVar45 * fVar125 + fVar147 * fVar91 + fVar149 * fVar49) *
                              fVar85 * fVar85 * 3.0 +
                              (fVar145 * fStack_e08 +
                              (float)(~uVar132 & (uint)fVar124 |
                                     (uint)(((1.0 - auVar102._8_4_ * fVar156) * fVar156 + fVar156) *
                                           (fVar82 * fVar124 + fVar135 * fVar88)) & uVar132) *
                              fVar125 + (float)(~uVar132 & (uint)fVar126 |
                                               (uint)(((1.0 - (fVar88 + fVar54) * fVar138) * fVar138
                                                      + fVar138) * auVar128._8_4_) & uVar132) *
                                        fVar91 + fVar105 * fVar49) *
                              (fVar64 - fVar85 * fVar85) * 3.0 +
                             (fVar104 * fStack_e08 +
                             (float)(~uVar132 & (uint)fVar122 |
                                    (uint)(((1.0 - auVar61._8_4_ * fVar112) * fVar112 + fVar112) *
                                          (fVar134 * fVar82 + fVar74 * fVar122)) & uVar132) *
                             fVar125 + (float)(~uVar132 & (uint)fVar136 |
                                              (uint)(((1.0 - auVar143._8_4_ * fVar118) * fVar118 +
                                                     fVar118) *
                                                    (fVar54 * fVar136 + fVar137 * fVar74)) & uVar132
                                              ) * fVar91 + fVar103 * fVar49) *
                             (fVar52 * fVar52 - fVar64) * 3.0) -
                            (fVar94 * fStack_e08 +
                            fVar139 * fVar125 + fVar127 * fVar91 + fVar3 * fVar49) *
                            fVar52 * fVar52 * 3.0) * fVar119) & uVar12;
        puVar24[3] = ~uVar13 & puVar24[3] |
                     (uint)((((fVar48 * fStack_e04 +
                              fVar45 * fVar38 + fVar147 * fVar120 + fVar149 * fVar53) *
                              fVar89 * fVar89 * 3.0 +
                              (fVar145 * fStack_e04 +
                              (float)(~uVar133 & (uint)fVar124 |
                                     (uint)(((1.0 - auVar102._12_4_ * fVar146) * fVar146 + fVar146)
                                           * (fVar86 * fVar124 + fVar135 * fVar92)) & uVar133) *
                              fVar38 + (float)(~uVar133 & (uint)fVar126 |
                                              (uint)(((1.0 - (fVar92 + fVar67) * fVar148) * fVar148
                                                     + fVar148) * auVar128._12_4_) & uVar133) *
                                       fVar120 + fVar105 * fVar53) *
                              (fVar79 - fVar89 * fVar89) * 3.0 +
                             (fVar104 * fStack_e04 +
                             (float)(~uVar133 & (uint)fVar122 |
                                    (uint)(((1.0 - auVar61._12_4_ * fVar144) * fVar144 + fVar144) *
                                          (fVar134 * fVar86 + fVar75 * fVar122)) & uVar133) * fVar38
                             + (float)(~uVar133 & (uint)fVar136 |
                                      (uint)(((1.0 - auVar143._12_4_ * fVar129) * fVar129 + fVar129)
                                            * (fVar67 * fVar136 + fVar137 * fVar75)) & uVar133) *
                               fVar120 + fVar103 * fVar53) * (fVar55 * fVar55 - fVar79) * 3.0) -
                            (fVar94 * fStack_e04 +
                            fVar139 * fVar38 + fVar127 * fVar120 + fVar3 * fVar53) *
                            fVar55 * fVar55 * 3.0) * fVar119) & uVar13;
        puVar24 = puVar24 + lVar27;
        in_XMM6 = _local_e10;
      }
    }
LAB_005cd5fe:
    pfVar21 = *(float **)This.ptr;
    pfVar51 = *(float **)(This.ptr + 8);
    goto LAB_005cd608;
  default:
    goto switchD_005cae46_caseD_5;
  case 7:
    vVar157 = eval_general(this,valid,(SubdividedGeneralPatch *)This.ptr,
                           (vfloat_impl<4> *)((ulong)u & 0xfffffffffffffff0),v,depth);
    RVar25.ptr = vVar157.field_0._8_8_;
    break;
  case 8:
    vVar157 = eval_quad(this,valid,(SubdividedQuadPatch *)This.ptr,
                        (vfloat_impl<4> *)((ulong)u & 0xfffffffffffffff0),v,dscale,depth);
    RVar25.ptr = vVar157.field_0._8_8_;
    break;
  case 9:
    array_t<embree::CatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>::
    array_t(&local_d80);
    uVar37 = (ulong)u & 0xfffffffffffffff0;
    paVar17 = &local_d80;
    paVar18 = &local_d80;
    lVar36 = 0;
    for (lVar27 = 0; pDVar20 = &paVar17->items[0].crease_weight, local_e40 = &paVar18->items[0].ring
        , lVar27 != 4; lVar27 = lVar27 + 1) {
      local_d80.items[lVar27].border_index = *(int *)(uVar37 + lVar36);
      uVar19 = *(uint *)(uVar37 + 4 + lVar36);
      local_d80.items[lVar27].face_valence = uVar19;
      local_d80.items[lVar27].edge_valence = uVar19 * 2;
      local_d80.items[lVar27].vertex_crease_weight = *(float *)(uVar37 + 8 + lVar36);
      lVar36 = lVar36 + 0xc;
      for (uVar35 = 0; uVar35 < uVar19; uVar35 = uVar35 + 1) {
        pfVar21 = local_d80.items[lVar27].crease_weight.data;
        if ((0xf < uVar35) &&
           ((DynamicStackArray<float,_16UL,_64UL> *)pfVar21 ==
            &local_d80.items[lVar27].crease_weight)) {
          pfVar21 = (float *)operator_new__(0x100);
          local_d80.items[lVar27].crease_weight.data = pfVar21;
          for (lVar22 = 0; lVar22 != 0x10; lVar22 = lVar22 + 1) {
            local_d80.items[lVar27].crease_weight.data[lVar22] = pDVar20->arr[lVar22];
          }
          pfVar21 = local_d80.items[lVar27].crease_weight.data;
        }
        pfVar21[uVar35] = *(float *)(uVar37 + lVar36);
        lVar36 = lVar36 + 4;
        uVar19 = local_d80.items[lVar27].face_valence;
      }
      local_d80.items[lVar27].vertex_level = *(float *)(uVar37 + lVar36);
      local_d80.items[lVar27].edge_level = *(float *)(uVar37 + 4 + lVar36);
      local_d80.items[lVar27].eval_start_index = *(uint *)(uVar37 + 8 + lVar36);
      local_d80.items[lVar27].eval_unique_identifier = *(uint *)(uVar37 + 0xc + lVar36);
      puVar2 = (undefined8 *)(uVar37 + 0x10 + lVar36);
      uVar14 = puVar2[1];
      *(undefined8 *)&local_d80.items[lVar27].vtx.field_0 = *puVar2;
      *(undefined8 *)((long)&local_d80.items[lVar27].vtx.field_0 + 8) = uVar14;
      lVar36 = lVar36 + 0x20;
      for (uVar35 = 0; uVar35 < local_d80.items[lVar27].edge_valence; uVar35 = uVar35 + 1) {
        uVar14 = *(undefined8 *)(uVar37 + lVar36);
        uVar15 = ((undefined8 *)(uVar37 + lVar36))[1];
        pvVar23 = local_d80.items[lVar27].ring.data;
        if ((0x1f < uVar35) &&
           ((DynamicStackArray<embree::vfloat_impl<4>,_32UL,_128UL> *)pvVar23 ==
            &local_d80.items[lVar27].ring)) {
          pvVar23 = (vfloat_impl<4> *)vfloat_impl<4>::operator_new__(0x800);
          local_d80.items[lVar27].ring.data = pvVar23;
          for (lVar22 = 0; lVar22 != 0x200; lVar22 = lVar22 + 0x10) {
            puVar2 = (undefined8 *)((long)&local_e40->arr[0].field_0 + lVar22);
            uVar16 = puVar2[1];
            puVar1 = (undefined8 *)((long)&(local_d80.items[lVar27].ring.data)->field_0 + lVar22);
            *puVar1 = *puVar2;
            puVar1[1] = uVar16;
          }
          pvVar23 = local_d80.items[lVar27].ring.data;
        }
        *(undefined8 *)&pvVar23[uVar35].field_0 = uVar14;
        *(undefined8 *)((long)&pvVar23[uVar35].field_0 + 8) = uVar15;
        lVar36 = lVar36 + 0x10;
      }
      paVar17 = (array_t<embree::CatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>
                 *)(pDVar20 + 6);
      paVar18 = (array_t<embree::CatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>
                 *)(local_e40 + 1);
    }
    FeatureAdaptiveEvalSimd<embree::vboolf_impl<4>,_embree::vint_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>
    ::FeatureAdaptiveEvalSimd
              (&local_dc0,(CatmullClarkPatch *)&local_d80,(vboolf_impl<4> *)This.ptr,v,
               (vfloat_impl<4> *)depth,dscale,in_stack_00000008,*(float **)&valid->field_0,
               *(float **)((long)&valid->field_0 + 8),*(float **)&valid[1].field_0,
               *(float **)((long)&valid[1].field_0 + 8),*(float **)&valid[2].field_0,
               *(float **)((long)&valid[2].field_0 + 8),*(size_t *)&valid[3].field_0,
               *(size_t *)((long)&valid[3].field_0 + 8));
    pfVar21 = *(float **)(This.ptr + 8);
    this->P = *(float **)This.ptr;
    this->dPdu = pfVar21;
    array_t<embree::CatmullClark1RingT<embree::vfloat_impl<4>,_embree::vfloat_impl<4>_>,_4UL>::
    ~array_t(&local_d80);
    RVar25.ptr = extraout_RDX_00;
  }
  vVar157.field_0._8_8_ = RVar25.ptr;
  vVar157.field_0._0_8_ = this;
  return (vboolf_impl<4>)vVar157.field_0;
}

Assistant:

vbool eval(const vbool& valid, Ref This, const vfloat& u, const vfloat& v, const float dscale, const size_t depth) 
        {
          if (!This) return false;
          switch (This.type()) 
          {
          case Patch::BILINEAR_PATCH: {
            ((typename Patch::BilinearPatch*)This.object())->patch.eval(valid,u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale,dstride,N); 
            return valid;
          }
          case Patch::BSPLINE_PATCH: {
            ((typename Patch::BSplinePatch*)This.object())->patch.eval(valid,u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale,dstride,N);
            return valid;
          }
          case Patch::BEZIER_PATCH: {
            ((typename Patch::BezierPatch*)This.object())->patch.eval(valid,u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale,dstride,N);
            return valid;
          }
          case Patch::GREGORY_PATCH: {
            ((typename Patch::GregoryPatch*)This.object())->patch.eval(valid,u,v,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dscale,dstride,N); 
            return valid;
          }
          case Patch::SUBDIVIDED_QUAD_PATCH: {
            return eval_quad(valid,((typename Patch::SubdividedQuadPatch*)This.object()),u,v,dscale,depth);
          }
          case Patch::SUBDIVIDED_GENERAL_PATCH: { 
            assert(dscale == 1.0f); 
            return eval_general(valid,((typename Patch::SubdividedGeneralPatch*)This.object()),u,v,depth); 
          }
          case Patch::EVAL_PATCH: { 
            CatmullClarkPatch patch; patch.deserialize(This.object());
            FeatureAdaptiveEvalSimd<vbool,vint,vfloat,Vertex,Vertex_t>(patch,valid,u,v,dscale,depth,P,dPdu,dPdv,ddPdudu,ddPdvdv,ddPdudv,dstride,N);
            return valid;
          }
          default: 
            assert(false); 
            return false;
          }
        }